

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  _func_int *p_Var19;
  int *piVar20;
  long lVar21;
  void *pvVar22;
  size_t sVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  uint uVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  long lVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  undefined1 (*pauVar40) [32];
  long lVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  uint uVar53;
  undefined1 (*pauVar54) [16];
  long lVar55;
  undefined1 (*pauVar56) [16];
  undefined1 (*pauVar57) [16];
  long lVar58;
  undefined1 auVar59 [16];
  undefined1 auVar67 [16];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar60 [16];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [28];
  undefined1 auVar128 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar160 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar132 [16];
  undefined1 auVar170 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar140 [16];
  undefined1 auVar182 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar183 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar184 [64];
  float fVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar220 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  v4sf one;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar288 [64];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar307;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar320;
  float fVar324;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  undefined1 auVar325 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [64];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [64];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  Option opt_flatten;
  undefined1 (*local_3b8) [32];
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  int local_3a0;
  Allocator *local_398;
  int local_390;
  int iStack_38c;
  undefined8 uStack_388;
  undefined4 uStack_380;
  size_t local_378;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  long local_300;
  ulong local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  float local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar380 [12];
  undefined1 auVar81 [32];
  undefined1 auVar85 [32];
  undefined1 auVar91 [32];
  float fVar94;
  undefined1 auVar120 [32];
  float fVar129;
  undefined1 auVar161 [32];
  
  local_390 = bottom_blob->dims;
  if ((local_390 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]))) {
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]),
                bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
    iVar43 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var19 = this->_vptr_InnerProduct_x86_fma[-3];
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var19),
                 *(int *)(&this->field_0xe0 + (long)p_Var19),
                 (Mat *)(&this->field_0xe8 + (long)p_Var19),opt);
      iVar43 = 0;
    }
  }
  else {
    piVar20 = bottom_blob->refcount;
    local_3b8 = (undefined1 (*) [32])bottom_blob->data;
    uStack_3b0 = SUB84(bottom_blob->refcount,0);
    uStack_3ac = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_3a8 = (undefined4)bottom_blob->elemsize;
    uStack_3a4 = (undefined4)(bottom_blob->elemsize >> 0x20);
    local_3a0 = bottom_blob->elempack;
    local_398 = bottom_blob->allocator;
    uVar3 = bottom_blob->w;
    uVar4 = bottom_blob->h;
    uVar5 = bottom_blob->d;
    uVar6 = bottom_blob->c;
    auVar380._8_4_ = uVar6;
    auVar380._4_4_ = uVar5;
    auVar380._0_4_ = uVar4;
    uStack_388 = auVar380._0_8_;
    local_378 = bottom_blob->cstep;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + 1;
      UNLOCK();
    }
    iStack_38c = uVar3;
    uStack_380 = uVar6;
    if (bottom_blob->dims != 1) {
      auVar272[0] = opt->lightmode;
      auVar272._1_3_ = *(undefined3 *)&opt->field_0x1;
      auVar272._4_4_ = opt->num_threads;
      auVar272._8_8_ = opt->blob_allocator;
      uVar7 = opt->workspace_allocator;
      uVar8 = opt->openmp_blocktime;
      uVar9 = opt->use_winograd_convolution;
      uVar10 = opt->use_sgemm_convolution;
      uVar11 = opt->use_int8_inference;
      uVar12 = opt->use_vulkan_compute;
      auVar272[0x1f] = uVar12;
      auVar272[0x1e] = uVar11;
      auVar272[0x1d] = uVar10;
      auVar272[0x1c] = uVar9;
      auVar272._24_4_ = uVar8;
      auVar272._16_8_ = uVar7;
      local_58._0_1_ = opt->use_bf16_storage;
      local_58._1_1_ = opt->use_fp16_packed;
      local_58._2_1_ = opt->use_fp16_storage;
      local_58._3_1_ = opt->use_fp16_arithmetic;
      local_58._4_1_ = opt->use_int8_packed;
      local_58._5_1_ = opt->use_int8_storage;
      local_58._6_1_ = opt->use_int8_arithmetic;
      local_58._7_1_ = opt->use_packing_layout;
      uStack_50._0_1_ = opt->use_shader_pack8;
      uStack_50._1_1_ = opt->use_subgroup_basic;
      uStack_50._2_1_ = opt->use_subgroup_vote;
      uStack_50._3_1_ = opt->use_subgroup_ballot;
      uStack_50._4_1_ = opt->use_subgroup_shuffle;
      uStack_50._5_1_ = opt->use_image_storage;
      uStack_50._6_1_ = opt->use_tensor_storage;
      uStack_50._7_1_ = opt->use_reserved_0;
      uStack_48._0_4_ = opt->flush_denormals;
      uStack_48._4_1_ = opt->use_local_pool_allocator;
      uStack_48._5_1_ = opt->use_shader_local_memory;
      uStack_48._6_1_ = opt->use_cooperative_matrix;
      uStack_48._7_1_ = opt->use_winograd23_convolution;
      uStack_40._0_1_ = opt->use_winograd43_convolution;
      uStack_40._1_1_ = opt->use_winograd63_convolution;
      uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_40._3_1_ = opt->use_reserved_7;
      uStack_40._4_1_ = opt->use_reserved_8;
      uStack_40._5_1_ = opt->use_reserved_9;
      uStack_40._6_1_ = opt->use_reserved_10;
      uStack_40._7_1_ = opt->use_reserved_11;
      local_78 = auVar272._0_8_;
      pAStack_70 = opt->workspace_allocator;
      auStack_68 = auVar272._16_16_;
      (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_3b8);
    }
    uVar32 = 1;
    if (opt->use_packing_layout == true) {
      uVar32 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) & 7) != 0) {
        uVar32 = (uint)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) &
                        3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
                         (int)uVar32,
                (ulong)uVar32 * (CONCAT44(uStack_3a4,local_3a8) / (ulong)(long)local_3a0),uVar32,
                opt->blob_allocator);
    iVar43 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var19 = this->_vptr_InnerProduct_x86_fma[-3];
      uVar18 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var19);
      uVar53 = local_3a0 * iStack_38c;
      iVar31 = top_blob->elempack;
      uVar32 = top_blob->w;
      lVar21 = *(long *)(&this->field_0x178 + (long)p_Var19);
      iVar43 = 0;
      if (iVar31 == 1) {
        if (0 < (int)uVar32 >> 3) {
          local_220 = (ulong)(uint)((int)uVar32 >> 3);
          lVar44 = 7;
          lVar39 = 6;
          lVar41 = 5;
          lVar42 = 4;
          lVar45 = 3;
          lVar35 = 2;
          lVar55 = 1;
          local_300 = 0;
          uVar34 = 0;
          do {
            uVar1 = uVar34 * 8;
            auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
            if (lVar21 != 0) {
              auVar288 = ZEXT3264(*(undefined1 (*) [32])(lVar21 + uVar34 * 0x20));
            }
            auVar272 = auVar288._0_32_;
            lVar33 = (long)(this->weight_data_tm).w;
            pvVar22 = (this->weight_data_tm).data;
            sVar23 = (this->weight_data_tm).elemsize;
            pauVar40 = local_3b8;
            if ((int)uVar53 < 8) {
              lVar33 = sVar23 * lVar33;
              lVar37 = lVar33 * uVar1;
              lVar47 = (uVar1 | 1) * lVar33;
              lVar46 = (uVar1 | 2) * lVar33;
              lVar52 = (uVar1 | 3) * lVar33;
              lVar51 = (uVar1 | 4) * lVar33;
              lVar50 = (uVar1 | 5) * lVar33;
              lVar49 = (uVar1 | 6) * lVar33;
              lVar58 = (uVar1 | 7) * lVar33;
              uVar30 = 0;
              local_b8 = SUB6432(ZEXT864(0),0);
              local_d8 = SUB6432(ZEXT864(0),0);
              local_f8 = SUB6432(ZEXT864(0),0);
              auVar186 = ZEXT816(0);
              local_138 = SUB6432(ZEXT864(0),0);
              local_158 = SUB6432(ZEXT864(0),0);
              auVar131 = ZEXT816(0);
              local_98 = SUB6432(ZEXT864(0),0);
            }
            else {
              lVar58 = sVar23 * lVar44 * lVar33;
              lVar49 = sVar23 * lVar39 * lVar33;
              lVar50 = sVar23 * lVar41 * lVar33;
              lVar51 = sVar23 * lVar42 * lVar33;
              lVar52 = sVar23 * lVar45 * lVar33;
              lVar46 = sVar23 * lVar35 * lVar33;
              lVar47 = sVar23 * lVar55 * lVar33;
              lVar33 = sVar23 * local_300 * lVar33;
              local_2b8._0_8_ = lVar33;
              auVar128 = ZEXT864(0);
              auVar131 = ZEXT816(0);
              auVar335 = ZEXT864(0);
              auVar266 = ZEXT864(0);
              auVar186 = ZEXT816(0);
              auVar379 = ZEXT864(0);
              auVar211 = ZEXT864(0);
              auVar184 = ZEXT864(0);
              iVar43 = 7;
              lVar37 = 0;
              do {
                auVar90 = *(undefined1 (*) [32])(*local_3b8 + lVar37 * 2);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar33));
                auVar77 = vcvtph2ps_f16c(auVar215);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar47));
                auVar88 = vcvtph2ps_f16c(auVar215);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar46));
                auVar127 = vcvtph2ps_f16c(auVar215);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar52));
                auVar182 = vcvtph2ps_f16c(auVar215);
                auVar215 = vfmadd231ps_fma(auVar128._0_32_,auVar90,auVar77);
                auVar128 = ZEXT1664(auVar215);
                local_98 = ZEXT1632(auVar215);
                auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar90,auVar88);
                auVar215 = vfmadd231ps_fma(auVar335._0_32_,auVar90,auVar127);
                auVar335 = ZEXT1664(auVar215);
                local_158 = ZEXT1632(auVar215);
                auVar215 = vfmadd231ps_fma(auVar266._0_32_,auVar90,auVar182);
                auVar266 = ZEXT1664(auVar215);
                local_138 = ZEXT1632(auVar215);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar51));
                auVar77 = vcvtph2ps_f16c(auVar215);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar50));
                auVar88 = vcvtph2ps_f16c(auVar215);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar49));
                auVar127 = vcvtph2ps_f16c(auVar215);
                auVar215 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + lVar58));
                auVar182 = vcvtph2ps_f16c(auVar215);
                auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar90,auVar77);
                auVar215 = vfmadd231ps_fma(auVar379._0_32_,auVar90,auVar88);
                auVar379 = ZEXT1664(auVar215);
                local_f8 = ZEXT1632(auVar215);
                auVar215 = vfmadd231ps_fma(auVar211._0_32_,auVar90,auVar127);
                auVar211 = ZEXT1664(auVar215);
                local_d8 = ZEXT1632(auVar215);
                auVar215 = vfmadd231ps_fma(auVar184._0_32_,auVar90,auVar182);
                auVar184 = ZEXT1664(auVar215);
                local_b8 = ZEXT1632(auVar215);
                pauVar40 = pauVar40 + 1;
                iVar43 = iVar43 + 8;
                lVar37 = lVar37 + 0x10;
              } while (iVar43 < (int)uVar53);
              lVar58 = lVar58 + lVar37;
              lVar49 = lVar49 + lVar37;
              lVar50 = lVar50 + lVar37;
              lVar51 = lVar51 + lVar37;
              lVar52 = lVar52 + lVar37;
              lVar46 = lVar46 + lVar37;
              lVar47 = lVar47 + lVar37;
              lVar37 = lVar33 + lVar37;
              uVar30 = uVar53 & 0xfffffff8;
            }
            local_118 = ZEXT1632(auVar186);
            local_178 = ZEXT1632(auVar131);
            local_348._0_8_ = (long)pvVar22 + lVar47;
            local_358._0_8_ = (long)pvVar22 + lVar46;
            local_368._0_8_ = (long)pvVar22 + lVar52;
            local_2f8 = uVar34;
            local_2f0 = lVar55;
            local_2e8 = lVar35;
            local_2e0 = lVar45;
            local_2d8 = lVar42;
            local_2d0 = lVar41;
            local_2c8 = lVar39;
            local_2c0 = lVar44;
            if ((int)uVar30 < (int)uVar53) {
              lVar44 = 0;
              do {
                local_2b8 = auVar288._0_32_;
                local_318 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                fVar94 = float16_to_float32(*(unsigned_short *)((long)pvVar22 + lVar44 * 2 + lVar37)
                                           );
                auVar272 = _local_218;
                local_218._4_4_ = extraout_XMM0_Db;
                local_218._0_4_ = fVar94;
                fStack_210 = (float)extraout_XMM0_Dc;
                _fStack_208 = auVar272._16_16_;
                fStack_20c = (float)extraout_XMM0_Dd;
                _local_328 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                fVar94 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar44 * 2));
                local_238 = CONCAT44(extraout_XMM0_Db_00,fVar94);
                local_338 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                local_248._0_4_ =
                     float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar44 * 2));
                local_248._4_4_ = extraout_XMM0_Db_01;
                local_248._8_4_ = extraout_XMM0_Dc_00;
                local_248._12_4_ = extraout_XMM0_Dd_00;
                local_258 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                local_268._0_4_ =
                     float16_to_float32(*(unsigned_short *)(local_368._0_8_ + lVar44 * 2));
                local_268._4_4_ = extraout_XMM0_Db_02;
                local_268._8_4_ = extraout_XMM0_Dc_01;
                local_268._12_4_ = extraout_XMM0_Dd_01;
                local_278 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                local_288 = float16_to_float32(*(unsigned_short *)
                                                ((long)pvVar22 + lVar44 * 2 + lVar51));
                local_198._0_16_ = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                uStack_284 = extraout_XMM0_Db_03;
                uStack_280 = extraout_XMM0_Dc_02;
                uStack_27c = extraout_XMM0_Dd_02;
                fVar94 = float16_to_float32(*(unsigned_short *)((long)pvVar22 + lVar44 * 2 + lVar50)
                                           );
                auVar272 = local_1b8;
                local_1b8._4_4_ = extraout_XMM0_Db_04;
                local_1b8._0_4_ = fVar94;
                local_1b8._8_4_ = extraout_XMM0_Dc_03;
                local_1b8._16_16_ = auVar272._16_16_;
                local_1b8._12_4_ = extraout_XMM0_Dd_03;
                local_1d8._0_16_ = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                fVar94 = float16_to_float32(*(unsigned_short *)((long)pvVar22 + lVar44 * 2 + lVar49)
                                           );
                auVar272 = local_1f8;
                local_1f8._4_4_ = extraout_XMM0_Db_05;
                local_1f8._0_4_ = fVar94;
                local_1f8._8_4_ = extraout_XMM0_Dc_04;
                local_1f8._16_16_ = auVar272._16_16_;
                local_1f8._12_4_ = extraout_XMM0_Dd_04;
                local_298 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
                auVar288._0_4_ =
                     float16_to_float32(*(unsigned_short *)((long)pvVar22 + lVar44 * 2 + lVar58));
                auVar288._4_60_ = extraout_var;
                auVar131._4_4_ = uStack_284;
                auVar131._0_4_ = local_288;
                auVar131._8_4_ = uStack_280;
                auVar131._12_4_ = uStack_27c;
                auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_1b8._0_4_),0x10);
                auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_1f8._0_4_),0x20);
                auVar131 = vinsertps_avx(auVar131,auVar288._0_16_,0x30);
                auVar186 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
                auVar186 = vinsertps_avx(auVar186,ZEXT416((uint)local_248._0_4_),0x20);
                auVar186 = vinsertps_avx(auVar186,ZEXT416((uint)local_268._0_4_),0x30);
                auVar90._16_16_ = auVar131;
                auVar90._0_16_ = auVar186;
                auVar131 = vinsertps_avx(local_278,ZEXT416((uint)local_198._0_4_),0x10);
                auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_1d8._0_4_),0x20);
                auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_298._0_4_),0x30);
                auVar186 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
                auVar186 = vinsertps_avx(auVar186,ZEXT416((uint)local_338._0_4_),0x20);
                auVar186 = vinsertps_avx(auVar186,ZEXT416((uint)local_258._0_4_),0x30);
                auVar77._16_16_ = auVar131;
                auVar77._0_16_ = auVar186;
                auVar131 = vfmadd231ps_fma(local_2b8,auVar90,auVar77);
                auVar288 = ZEXT1664(auVar131);
                auVar272 = ZEXT1632(auVar131);
                lVar44 = lVar44 + 1;
              } while (uVar53 - uVar30 != (int)lVar44);
            }
            auVar90 = vhaddps_avx(local_98,local_178);
            auVar77 = vhaddps_avx(local_158,local_138);
            auVar77 = vhaddps_avx(auVar90,auVar77);
            auVar90 = vhaddps_avx(local_118,local_f8);
            auVar88 = vhaddps_avx(local_d8,local_b8);
            auVar88 = vhaddps_avx(auVar90,auVar88);
            auVar90 = vblendps_avx(auVar77,auVar88,0xf0);
            auVar77 = vperm2f128_avx(auVar77,auVar88,0x21);
            fVar94 = auVar77._0_4_ + auVar272._0_4_ + auVar90._0_4_;
            fVar129 = auVar77._4_4_ + auVar272._4_4_ + auVar90._4_4_;
            auVar88._0_8_ = CONCAT44(fVar129,fVar94);
            auVar88._8_4_ = auVar77._8_4_ + auVar272._8_4_ + auVar90._8_4_;
            auVar88._12_4_ = auVar77._12_4_ + auVar272._12_4_ + auVar90._12_4_;
            auVar88._16_4_ = auVar77._16_4_ + auVar272._16_4_ + auVar90._16_4_;
            auVar88._20_4_ = auVar77._20_4_ + auVar272._20_4_ + auVar90._20_4_;
            auVar88._24_4_ = auVar77._24_4_ + auVar272._24_4_ + auVar90._24_4_;
            auVar88._28_4_ = auVar77._28_4_ + auVar272._28_4_ + auVar90._28_4_;
            switch(uVar18) {
            case 1:
              auVar88 = vmaxps_avx(auVar88,_DAT_0059a1e0);
              break;
            case 2:
              auVar272 = vmaxps_avx(auVar88,ZEXT832(0) << 0x20);
              auVar90 = vminps_avx(auVar88,ZEXT832(0) << 0x20);
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar93._4_4_ = uVar2;
              auVar93._0_4_ = uVar2;
              auVar93._8_4_ = uVar2;
              auVar93._12_4_ = uVar2;
              auVar93._16_4_ = uVar2;
              auVar93._20_4_ = uVar2;
              auVar93._24_4_ = uVar2;
              auVar93._28_4_ = uVar2;
              auVar131 = vfmadd213ps_fma(auVar93,auVar90,auVar272);
              auVar88 = ZEXT1632(auVar131);
              break;
            case 3:
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar122._4_4_ = uVar2;
              auVar122._0_4_ = uVar2;
              auVar122._8_4_ = uVar2;
              auVar122._12_4_ = uVar2;
              auVar122._16_4_ = uVar2;
              auVar122._20_4_ = uVar2;
              auVar122._24_4_ = uVar2;
              auVar122._28_4_ = uVar2;
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar179._4_4_ = uVar2;
              auVar179._0_4_ = uVar2;
              auVar179._8_4_ = uVar2;
              auVar179._12_4_ = uVar2;
              auVar179._16_4_ = uVar2;
              auVar179._20_4_ = uVar2;
              auVar179._24_4_ = uVar2;
              auVar179._28_4_ = uVar2;
              auVar272 = vmaxps_avx(auVar88,auVar122);
              auVar88 = vminps_avx(auVar272,auVar179);
              break;
            case 4:
              auVar89._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar89._8_4_ = -auVar88._8_4_;
              auVar89._12_4_ = -auVar88._12_4_;
              auVar89._16_4_ = -auVar88._16_4_;
              auVar89._20_4_ = -auVar88._20_4_;
              auVar89._24_4_ = -auVar88._24_4_;
              auVar89._28_4_ = -auVar88._28_4_;
              auVar123._8_4_ = 0x42b0c0a5;
              auVar123._0_8_ = 0x42b0c0a542b0c0a5;
              auVar123._12_4_ = 0x42b0c0a5;
              auVar123._16_4_ = 0x42b0c0a5;
              auVar123._20_4_ = 0x42b0c0a5;
              auVar123._24_4_ = 0x42b0c0a5;
              auVar123._28_4_ = 0x42b0c0a5;
              auVar272 = vminps_avx(auVar89,auVar123);
              auVar124._8_4_ = 0xc2b0c0a5;
              auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar124._12_4_ = 0xc2b0c0a5;
              auVar124._16_4_ = 0xc2b0c0a5;
              auVar124._20_4_ = 0xc2b0c0a5;
              auVar124._24_4_ = 0xc2b0c0a5;
              auVar124._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar272,auVar124);
              auVar125._8_4_ = 0x3fb8aa3b;
              auVar125._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar125._12_4_ = 0x3fb8aa3b;
              auVar125._16_4_ = 0x3fb8aa3b;
              auVar125._20_4_ = 0x3fb8aa3b;
              auVar125._24_4_ = 0x3fb8aa3b;
              auVar125._28_4_ = 0x3fb8aa3b;
              auVar242._8_4_ = 0x3f000000;
              auVar242._0_8_ = 0x3f0000003f000000;
              auVar242._12_4_ = 0x3f000000;
              auVar242._16_4_ = 0x3f000000;
              auVar242._20_4_ = 0x3f000000;
              auVar242._24_4_ = 0x3f000000;
              auVar242._28_4_ = 0x3f000000;
              auVar131 = vfmadd213ps_fma(auVar125,auVar90,auVar242);
              auVar77 = vroundps_avx(ZEXT1632(auVar131),1);
              auVar272 = vcmpps_avx(ZEXT1632(auVar131),auVar77,1);
              auVar265._8_4_ = 0x3f800000;
              auVar265._0_8_ = 0x3f8000003f800000;
              auVar265._12_4_ = 0x3f800000;
              auVar265._16_4_ = 0x3f800000;
              auVar265._20_4_ = 0x3f800000;
              auVar265._24_4_ = 0x3f800000;
              auVar265._28_4_ = 0x3f800000;
              auVar272 = vandps_avx(auVar272,auVar265);
              auVar272 = vsubps_avx(auVar77,auVar272);
              auVar180._8_4_ = 0x3f318000;
              auVar180._0_8_ = 0x3f3180003f318000;
              auVar180._12_4_ = 0x3f318000;
              auVar180._16_4_ = 0x3f318000;
              auVar180._20_4_ = 0x3f318000;
              auVar180._24_4_ = 0x3f318000;
              auVar180._28_4_ = 0x3f318000;
              auVar131 = vfmsub231ps_fma(auVar90,auVar272,auVar180);
              auVar181._8_4_ = 0x395e8083;
              auVar181._0_8_ = 0x395e8083395e8083;
              auVar181._12_4_ = 0x395e8083;
              auVar181._16_4_ = 0x395e8083;
              auVar181._20_4_ = 0x395e8083;
              auVar181._24_4_ = 0x395e8083;
              auVar181._28_4_ = 0x395e8083;
              auVar186 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar272,auVar181);
              auVar90 = ZEXT1632(auVar186);
              auVar29._28_4_ = 0x395e8083;
              auVar29._0_28_ =
                   ZEXT1628(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                      CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                               CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                        auVar186._0_4_ * auVar186._0_4_))));
              auVar210._8_4_ = 0x39506967;
              auVar210._0_8_ = 0x3950696739506967;
              auVar210._12_4_ = 0x39506967;
              auVar210._16_4_ = 0x39506967;
              auVar210._20_4_ = 0x39506967;
              auVar210._24_4_ = 0x39506967;
              auVar210._28_4_ = 0x39506967;
              auVar284._8_4_ = 0x3ab743ce;
              auVar284._0_8_ = 0x3ab743ce3ab743ce;
              auVar284._12_4_ = 0x3ab743ce;
              auVar284._16_4_ = 0x3ab743ce;
              auVar284._20_4_ = 0x3ab743ce;
              auVar284._24_4_ = 0x3ab743ce;
              auVar284._28_4_ = 0x3ab743ce;
              auVar131 = vfmadd213ps_fma(auVar210,auVar90,auVar284);
              auVar285._8_4_ = 0x3c088908;
              auVar285._0_8_ = 0x3c0889083c088908;
              auVar285._12_4_ = 0x3c088908;
              auVar285._16_4_ = 0x3c088908;
              auVar285._20_4_ = 0x3c088908;
              auVar285._24_4_ = 0x3c088908;
              auVar285._28_4_ = 0x3c088908;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar285);
              auVar286._8_4_ = 0x3d2aa9c1;
              auVar286._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar286._12_4_ = 0x3d2aa9c1;
              auVar286._16_4_ = 0x3d2aa9c1;
              auVar286._20_4_ = 0x3d2aa9c1;
              auVar286._24_4_ = 0x3d2aa9c1;
              auVar286._28_4_ = 0x3d2aa9c1;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar286);
              auVar287._8_4_ = 0x3e2aaaaa;
              auVar287._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar287._12_4_ = 0x3e2aaaaa;
              auVar287._16_4_ = 0x3e2aaaaa;
              auVar287._20_4_ = 0x3e2aaaaa;
              auVar287._24_4_ = 0x3e2aaaaa;
              auVar287._28_4_ = 0x3e2aaaaa;
              auVar90 = ZEXT1632(auVar186);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar287);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar242);
              auVar215 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar29,auVar90);
              auVar67._0_4_ = (int)auVar272._0_4_;
              auVar67._4_4_ = (int)auVar272._4_4_;
              auVar67._8_4_ = (int)auVar272._8_4_;
              auVar67._12_4_ = (int)auVar272._12_4_;
              auVar91._16_4_ = (int)auVar272._16_4_;
              auVar91._0_16_ = auVar67;
              auVar91._20_4_ = (int)auVar272._20_4_;
              auVar91._24_4_ = (int)auVar272._24_4_;
              auVar91._28_4_ = (int)auVar272._28_4_;
              auVar186 = vpslld_avx(auVar67,0x17);
              auVar131 = vpslld_avx(auVar91._16_16_,0x17);
              auVar140._8_4_ = 0x3f800000;
              auVar140._0_8_ = 0x3f8000003f800000;
              auVar140._12_4_ = 0x3f800000;
              auVar131 = vpaddd_avx(auVar131,auVar140);
              auVar186 = vpaddd_avx(auVar186,auVar140);
              auVar92._16_16_ = auVar131;
              auVar92._0_16_ = auVar186;
              auVar126._0_4_ = auVar215._0_4_ + 1.0;
              auVar126._4_4_ = auVar215._4_4_ + 1.0;
              auVar126._8_4_ = auVar215._8_4_ + 1.0;
              auVar126._12_4_ = auVar215._12_4_ + 1.0;
              auVar126._16_4_ = 0x3f800000;
              auVar126._20_4_ = 0x3f800000;
              auVar126._24_4_ = 0x3f800000;
              auVar126._28_4_ = 0x3f800000;
              auVar131 = vfmadd213ps_fma(auVar92,auVar126,auVar265);
              auVar272 = vrcpps_avx(ZEXT1632(auVar131));
              auVar131 = vfmsub213ps_fma(ZEXT1632(auVar131),auVar272,auVar265);
              auVar131 = vfnmadd132ps_fma(ZEXT1632(auVar131),auVar272,auVar272);
              auVar88 = ZEXT1632(auVar131);
              break;
            case 5:
              auVar306._8_4_ = 0x42b0c0a5;
              auVar306._0_8_ = 0x42b0c0a542b0c0a5;
              auVar306._12_4_ = 0x42b0c0a5;
              auVar306._16_4_ = 0x42b0c0a5;
              auVar306._20_4_ = 0x42b0c0a5;
              auVar306._24_4_ = 0x42b0c0a5;
              auVar306._28_4_ = 0x42b0c0a5;
              auVar272 = vminps_avx(auVar88,auVar306);
              auVar317._8_4_ = 0xc2b0c0a5;
              auVar317._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar317._12_4_ = 0xc2b0c0a5;
              auVar317._16_4_ = 0xc2b0c0a5;
              auVar317._20_4_ = 0xc2b0c0a5;
              auVar317._24_4_ = 0xc2b0c0a5;
              auVar317._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar317,auVar272);
              auVar171._8_4_ = 0x3fb8aa3b;
              auVar171._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar171._12_4_ = 0x3fb8aa3b;
              auVar171._16_4_ = 0x3fb8aa3b;
              auVar171._20_4_ = 0x3fb8aa3b;
              auVar171._24_4_ = 0x3fb8aa3b;
              auVar171._28_4_ = 0x3fb8aa3b;
              auVar334._8_4_ = 0x3f000000;
              auVar334._0_8_ = 0x3f0000003f000000;
              auVar334._12_4_ = 0x3f000000;
              auVar334._16_4_ = 0x3f000000;
              auVar334._20_4_ = 0x3f000000;
              auVar334._24_4_ = 0x3f000000;
              auVar334._28_4_ = 0x3f000000;
              auVar131 = vfmadd213ps_fma(auVar171,auVar90,auVar334);
              auVar77 = vroundps_avx(ZEXT1632(auVar131),1);
              auVar272 = vcmpps_avx(ZEXT1632(auVar131),auVar77,1);
              auVar353._8_4_ = 0x3f800000;
              auVar353._0_8_ = 0x3f8000003f800000;
              auVar353._12_4_ = 0x3f800000;
              auVar353._16_4_ = 0x3f800000;
              auVar353._20_4_ = 0x3f800000;
              auVar353._24_4_ = 0x3f800000;
              auVar353._28_4_ = 0x3f800000;
              auVar272 = vandps_avx(auVar353,auVar272);
              auVar272 = vsubps_avx(auVar77,auVar272);
              auVar359._8_4_ = 0x3f318000;
              auVar359._0_8_ = 0x3f3180003f318000;
              auVar359._12_4_ = 0x3f318000;
              auVar359._16_4_ = 0x3f318000;
              auVar359._20_4_ = 0x3f318000;
              auVar359._24_4_ = 0x3f318000;
              auVar359._28_4_ = 0x3f318000;
              auVar131 = vfmsub231ps_fma(auVar90,auVar272,auVar359);
              auVar318._8_4_ = 0xb95e8083;
              auVar318._0_8_ = 0xb95e8083b95e8083;
              auVar318._12_4_ = 0xb95e8083;
              auVar318._16_4_ = 0xb95e8083;
              auVar318._20_4_ = 0xb95e8083;
              auVar318._24_4_ = 0xb95e8083;
              auVar318._28_4_ = 0xb95e8083;
              auVar186 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar272,auVar318);
              auVar90 = ZEXT1632(auVar186);
              auVar111._28_4_ = auVar77._28_4_;
              auVar111._0_28_ =
                   ZEXT1628(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                      CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                               CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                        auVar186._0_4_ * auVar186._0_4_))));
              auVar372._8_4_ = 0x39506967;
              auVar372._0_8_ = 0x3950696739506967;
              auVar372._12_4_ = 0x39506967;
              auVar372._16_4_ = 0x39506967;
              auVar372._20_4_ = 0x39506967;
              auVar372._24_4_ = 0x39506967;
              auVar372._28_4_ = 0x39506967;
              auVar365._8_4_ = 0x3ab743ce;
              auVar365._0_8_ = 0x3ab743ce3ab743ce;
              auVar365._12_4_ = 0x3ab743ce;
              auVar365._16_4_ = 0x3ab743ce;
              auVar365._20_4_ = 0x3ab743ce;
              auVar365._24_4_ = 0x3ab743ce;
              auVar365._28_4_ = 0x3ab743ce;
              auVar131 = vfmadd213ps_fma(auVar372,auVar90,auVar365);
              auVar378._8_4_ = 0x3c088908;
              auVar378._0_8_ = 0x3c0889083c088908;
              auVar378._12_4_ = 0x3c088908;
              auVar378._16_4_ = 0x3c088908;
              auVar378._20_4_ = 0x3c088908;
              auVar378._24_4_ = 0x3c088908;
              auVar378._28_4_ = 0x3c088908;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar378);
              auVar258._8_4_ = 0x3d2aa9c1;
              auVar258._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar258._12_4_ = 0x3d2aa9c1;
              auVar258._16_4_ = 0x3d2aa9c1;
              auVar258._20_4_ = 0x3d2aa9c1;
              auVar258._24_4_ = 0x3d2aa9c1;
              auVar258._28_4_ = 0x3d2aa9c1;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar258);
              auVar259._8_4_ = 0x3e2aaaaa;
              auVar259._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar259._12_4_ = 0x3e2aaaaa;
              auVar259._16_4_ = 0x3e2aaaaa;
              auVar259._20_4_ = 0x3e2aaaaa;
              auVar259._24_4_ = 0x3e2aaaaa;
              auVar259._28_4_ = 0x3e2aaaaa;
              auVar90 = ZEXT1632(auVar186);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar259);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar334);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar111,auVar90);
              auVar207._0_4_ = auVar131._0_4_ + 1.0;
              auVar207._4_4_ = auVar131._4_4_ + 1.0;
              auVar207._8_4_ = auVar131._8_4_ + 1.0;
              auVar207._12_4_ = auVar131._12_4_ + 1.0;
              auVar207._16_4_ = 0x3f800000;
              auVar207._20_4_ = 0x3f800000;
              auVar207._24_4_ = 0x3f800000;
              auVar207._28_4_ = 0x3f800000;
              auVar186._0_4_ = (int)auVar272._0_4_;
              auVar186._4_4_ = (int)auVar272._4_4_;
              auVar186._8_4_ = (int)auVar272._8_4_;
              auVar186._12_4_ = (int)auVar272._12_4_;
              auVar118._16_4_ = (int)auVar272._16_4_;
              auVar118._0_16_ = auVar186;
              auVar118._20_4_ = (int)auVar272._20_4_;
              auVar118._24_4_ = (int)auVar272._24_4_;
              auVar118._28_4_ = (int)auVar272._28_4_;
              auVar186 = vpslld_avx(auVar186,0x17);
              auVar131 = vpslld_avx(auVar118._16_16_,0x17);
              auVar291._8_4_ = 0x3f800000;
              auVar291._0_8_ = 0x3f8000003f800000;
              auVar291._12_4_ = 0x3f800000;
              auVar131 = vpaddd_avx(auVar131,auVar291);
              auVar186 = vpaddd_avx(auVar186,auVar291);
              auVar119._16_16_ = auVar131;
              auVar119._0_16_ = auVar186;
              auVar215 = vfmadd213ps_fma(auVar119,auVar207,auVar353);
              auVar172._8_4_ = 0x800000;
              auVar172._0_8_ = 0x80000000800000;
              auVar172._12_4_ = 0x800000;
              auVar172._16_4_ = 0x800000;
              auVar172._20_4_ = 0x800000;
              auVar172._24_4_ = 0x800000;
              auVar172._28_4_ = 0x800000;
              auVar272 = vmaxps_avx(ZEXT1632(auVar215),auVar172);
              auVar186 = vpsrld_avx(auVar272._0_16_,0x17);
              auVar131 = vpsrld_avx(auVar272._16_16_,0x17);
              auVar260._8_4_ = 0x807fffff;
              auVar260._0_8_ = 0x807fffff807fffff;
              auVar260._12_4_ = 0x807fffff;
              auVar260._16_4_ = 0x807fffff;
              auVar260._20_4_ = 0x807fffff;
              auVar260._24_4_ = 0x807fffff;
              auVar260._28_4_ = 0x807fffff;
              auVar272 = vandps_avx(auVar272,auVar260);
              auVar77 = vorps_avx(auVar334,auVar272);
              auVar261._8_4_ = 0x3f3504f3;
              auVar261._0_8_ = 0x3f3504f33f3504f3;
              auVar261._12_4_ = 0x3f3504f3;
              auVar261._16_4_ = 0x3f3504f3;
              auVar261._20_4_ = 0x3f3504f3;
              auVar261._24_4_ = 0x3f3504f3;
              auVar261._28_4_ = 0x3f3504f3;
              auVar90 = vcmpps_avx(auVar261,auVar77,2);
              auVar272 = vandnps_avx(auVar90,auVar77);
              auVar347._8_4_ = 0xbf800000;
              auVar347._0_8_ = 0xbf800000bf800000;
              auVar347._12_4_ = 0xbf800000;
              auVar347._16_4_ = 0xbf800000;
              auVar347._20_4_ = 0xbf800000;
              auVar347._24_4_ = 0xbf800000;
              auVar347._28_4_ = 0xbf800000;
              auVar173._0_4_ = auVar77._0_4_ + -1.0 + auVar272._0_4_;
              auVar173._4_4_ = auVar77._4_4_ + -1.0 + auVar272._4_4_;
              auVar173._8_4_ = auVar77._8_4_ + -1.0 + auVar272._8_4_;
              auVar173._12_4_ = auVar77._12_4_ + -1.0 + auVar272._12_4_;
              auVar173._16_4_ = auVar77._16_4_ + -1.0 + auVar272._16_4_;
              auVar173._20_4_ = auVar77._20_4_ + -1.0 + auVar272._20_4_;
              auVar173._24_4_ = auVar77._24_4_ + -1.0 + auVar272._24_4_;
              auVar173._28_4_ = auVar77._28_4_ + -1.0 + auVar272._28_4_;
              auVar131 = vpsubd_avx(auVar131,auVar90._16_16_);
              auVar268._8_4_ = 0xffffff81;
              auVar268._0_8_ = 0xffffff81ffffff81;
              auVar268._12_4_ = 0xffffff81;
              auVar131 = vpaddd_avx(auVar131,auVar268);
              auVar186 = vpsubd_avx(auVar186,auVar90._0_16_);
              auVar186 = vpaddd_avx(auVar186,auVar268);
              auVar208._16_16_ = auVar131;
              auVar208._0_16_ = auVar186;
              auVar241._0_4_ = auVar173._0_4_ * auVar173._0_4_;
              auVar241._4_4_ = auVar173._4_4_ * auVar173._4_4_;
              auVar241._8_4_ = auVar173._8_4_ * auVar173._8_4_;
              auVar241._12_4_ = auVar173._12_4_ * auVar173._12_4_;
              auVar241._16_4_ = auVar173._16_4_ * auVar173._16_4_;
              auVar241._20_4_ = auVar173._20_4_ * auVar173._20_4_;
              auVar241._24_4_ = auVar173._24_4_ * auVar173._24_4_;
              auVar241._28_4_ = 0;
              auVar262._8_4_ = 0x3d9021bb;
              auVar262._0_8_ = 0x3d9021bb3d9021bb;
              auVar262._12_4_ = 0x3d9021bb;
              auVar262._16_4_ = 0x3d9021bb;
              auVar262._20_4_ = 0x3d9021bb;
              auVar262._24_4_ = 0x3d9021bb;
              auVar262._28_4_ = 0x3d9021bb;
              auVar274._8_4_ = 0xbdebd1b8;
              auVar274._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar274._12_4_ = 0xbdebd1b8;
              auVar274._16_4_ = 0xbdebd1b8;
              auVar274._20_4_ = 0xbdebd1b8;
              auVar274._24_4_ = 0xbdebd1b8;
              auVar274._28_4_ = 0xbdebd1b8;
              auVar131 = vfmadd213ps_fma(auVar262,auVar173,auVar274);
              auVar275._8_4_ = 0x3def251a;
              auVar275._0_8_ = 0x3def251a3def251a;
              auVar275._12_4_ = 0x3def251a;
              auVar275._16_4_ = 0x3def251a;
              auVar275._20_4_ = 0x3def251a;
              auVar275._24_4_ = 0x3def251a;
              auVar275._28_4_ = 0x3def251a;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar173,auVar275);
              auVar276._8_4_ = 0xbdfe5d4f;
              auVar276._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar276._12_4_ = 0xbdfe5d4f;
              auVar276._16_4_ = 0xbdfe5d4f;
              auVar276._20_4_ = 0xbdfe5d4f;
              auVar276._24_4_ = 0xbdfe5d4f;
              auVar276._28_4_ = 0xbdfe5d4f;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar173,auVar276);
              auVar277._8_4_ = 0x3e11e9bf;
              auVar277._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar277._12_4_ = 0x3e11e9bf;
              auVar277._16_4_ = 0x3e11e9bf;
              auVar277._20_4_ = 0x3e11e9bf;
              auVar277._24_4_ = 0x3e11e9bf;
              auVar277._28_4_ = 0x3e11e9bf;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar173,auVar277);
              auVar278._8_4_ = 0xbe2aae50;
              auVar278._0_8_ = 0xbe2aae50be2aae50;
              auVar278._12_4_ = 0xbe2aae50;
              auVar278._16_4_ = 0xbe2aae50;
              auVar278._20_4_ = 0xbe2aae50;
              auVar278._24_4_ = 0xbe2aae50;
              auVar278._28_4_ = 0xbe2aae50;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar173,auVar278);
              auVar279._8_4_ = 0x3e4cceac;
              auVar279._0_8_ = 0x3e4cceac3e4cceac;
              auVar279._12_4_ = 0x3e4cceac;
              auVar279._16_4_ = 0x3e4cceac;
              auVar279._20_4_ = 0x3e4cceac;
              auVar279._24_4_ = 0x3e4cceac;
              auVar279._28_4_ = 0x3e4cceac;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar173,auVar279);
              auVar280._8_4_ = 0xbe7ffffc;
              auVar280._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar280._12_4_ = 0xbe7ffffc;
              auVar280._16_4_ = 0xbe7ffffc;
              auVar280._20_4_ = 0xbe7ffffc;
              auVar280._24_4_ = 0xbe7ffffc;
              auVar280._28_4_ = 0xbe7ffffc;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar173,auVar280);
              auVar281._8_4_ = 0x3eaaaaaa;
              auVar281._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar281._12_4_ = 0x3eaaaaaa;
              auVar281._16_4_ = 0x3eaaaaaa;
              auVar281._20_4_ = 0x3eaaaaaa;
              auVar281._24_4_ = 0x3eaaaaaa;
              auVar281._28_4_ = 0x3eaaaaaa;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar173,auVar281);
              auVar263._0_4_ = auVar241._0_4_ * auVar173._0_4_ * auVar131._0_4_;
              auVar263._4_4_ = auVar241._4_4_ * auVar173._4_4_ * auVar131._4_4_;
              auVar263._8_4_ = auVar241._8_4_ * auVar173._8_4_ * auVar131._8_4_;
              auVar263._12_4_ = auVar241._12_4_ * auVar173._12_4_ * auVar131._12_4_;
              auVar263._16_4_ = auVar241._16_4_ * auVar173._16_4_ * 0.0;
              auVar263._20_4_ = auVar241._20_4_ * auVar173._20_4_ * 0.0;
              auVar263._24_4_ = auVar241._24_4_ * auVar173._24_4_ * 0.0;
              auVar263._28_4_ = 0;
              auVar90 = vcvtdq2ps_avx(auVar208);
              auVar131 = vfmadd231ps_fma(auVar263,auVar90,auVar318);
              auVar131 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar334,auVar241);
              auVar272 = vcmpps_avx(ZEXT1632(auVar215),_DAT_0059a1e0,2);
              auVar77 = vsubps_avx(ZEXT1632(auVar131),auVar173);
              auVar131 = vfmsub231ps_fma(auVar77,auVar359,auVar90);
              auVar264._8_4_ = 0xc0000000;
              auVar264._0_8_ = 0xc0000000c0000000;
              auVar264._12_4_ = 0xc0000000;
              auVar264._16_4_ = 0xc0000000;
              auVar264._20_4_ = 0xc0000000;
              auVar264._24_4_ = 0xc0000000;
              auVar264._28_4_ = 0xc0000000;
              auVar174._0_4_ = auVar131._0_4_ * -2.0;
              auVar174._4_4_ = auVar131._4_4_ * -2.0;
              auVar174._8_4_ = auVar131._8_4_ * -2.0;
              auVar174._12_4_ = auVar131._12_4_ * -2.0;
              auVar174._16_4_ = 0x80000000;
              auVar174._20_4_ = 0x80000000;
              auVar174._24_4_ = 0x80000000;
              auVar174._28_4_ = 0;
              auVar209._8_4_ = 0x7fffffff;
              auVar209._0_8_ = 0x7fffffff7fffffff;
              auVar209._12_4_ = 0x7fffffff;
              auVar209._16_4_ = 0x7fffffff;
              auVar209._20_4_ = 0x7fffffff;
              auVar209._24_4_ = 0x7fffffff;
              auVar209._28_4_ = 0x7fffffff;
              auVar272 = vblendvps_avx(auVar174,auVar209,auVar272);
              auVar175._8_4_ = 0x42b0c0a5;
              auVar175._0_8_ = 0x42b0c0a542b0c0a5;
              auVar175._12_4_ = 0x42b0c0a5;
              auVar175._16_4_ = 0x42b0c0a5;
              auVar175._20_4_ = 0x42b0c0a5;
              auVar175._24_4_ = 0x42b0c0a5;
              auVar175._28_4_ = 0x42b0c0a5;
              auVar272 = vminps_avx(auVar272,auVar175);
              auVar176._8_4_ = 0xc2b0c0a5;
              auVar176._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar176._12_4_ = 0xc2b0c0a5;
              auVar176._16_4_ = 0xc2b0c0a5;
              auVar176._20_4_ = 0xc2b0c0a5;
              auVar176._24_4_ = 0xc2b0c0a5;
              auVar176._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar272,auVar176);
              auVar177._8_4_ = 0x3fb8aa3b;
              auVar177._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar177._12_4_ = 0x3fb8aa3b;
              auVar177._16_4_ = 0x3fb8aa3b;
              auVar177._20_4_ = 0x3fb8aa3b;
              auVar177._24_4_ = 0x3fb8aa3b;
              auVar177._28_4_ = 0x3fb8aa3b;
              auVar131 = vfmadd213ps_fma(auVar177,auVar90,auVar334);
              auVar77 = vroundps_avx(ZEXT1632(auVar131),1);
              auVar272 = vcmpps_avx(ZEXT1632(auVar131),auVar77,1);
              auVar272 = vandps_avx(auVar353,auVar272);
              auVar272 = vsubps_avx(auVar77,auVar272);
              auVar131 = vfmsub231ps_fma(auVar90,auVar272,auVar359);
              auVar186 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar272,auVar318);
              auVar90 = ZEXT1632(auVar186);
              auVar24._28_4_ = auVar77._28_4_;
              auVar24._0_28_ =
                   ZEXT1628(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                      CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                               CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                        auVar186._0_4_ * auVar186._0_4_))));
              auVar131 = vfmadd213ps_fma(auVar372,auVar90,auVar365);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar378);
              auVar282._8_4_ = 0x3d2aa9c1;
              auVar282._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar282._12_4_ = 0x3d2aa9c1;
              auVar282._16_4_ = 0x3d2aa9c1;
              auVar282._20_4_ = 0x3d2aa9c1;
              auVar282._24_4_ = 0x3d2aa9c1;
              auVar282._28_4_ = 0x3d2aa9c1;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar282);
              auVar283._8_4_ = 0x3e2aaaaa;
              auVar283._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar283._12_4_ = 0x3e2aaaaa;
              auVar283._16_4_ = 0x3e2aaaaa;
              auVar283._20_4_ = 0x3e2aaaaa;
              auVar283._24_4_ = 0x3e2aaaaa;
              auVar283._28_4_ = 0x3e2aaaaa;
              auVar90 = ZEXT1632(auVar186);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar283);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar334);
              auVar215 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar24,auVar90);
              auVar99._0_4_ = (int)auVar272._0_4_;
              auVar99._4_4_ = (int)auVar272._4_4_;
              auVar99._8_4_ = (int)auVar272._8_4_;
              auVar99._12_4_ = (int)auVar272._12_4_;
              auVar120._16_4_ = (int)auVar272._16_4_;
              auVar120._0_16_ = auVar99;
              auVar120._20_4_ = (int)auVar272._20_4_;
              auVar120._24_4_ = (int)auVar272._24_4_;
              auVar120._28_4_ = (int)auVar272._28_4_;
              auVar186 = vpslld_avx(auVar99,0x17);
              auVar131 = vpslld_avx(auVar120._16_16_,0x17);
              auVar131 = vpaddd_avx(auVar131,auVar291);
              auVar186 = vpaddd_avx(auVar186,auVar291);
              auVar121._16_16_ = auVar131;
              auVar121._0_16_ = auVar186;
              auVar178._0_4_ = auVar215._0_4_ + 1.0;
              auVar178._4_4_ = auVar215._4_4_ + 1.0;
              auVar178._8_4_ = auVar215._8_4_ + 1.0;
              auVar178._12_4_ = auVar215._12_4_ + 1.0;
              auVar178._16_4_ = 0x3f800000;
              auVar178._20_4_ = 0x3f800000;
              auVar178._24_4_ = 0x3f800000;
              auVar178._28_4_ = 0x3f800000;
              auVar131 = vfmadd213ps_fma(auVar121,auVar178,auVar353);
              auVar272 = vrcpps_avx(ZEXT1632(auVar131));
              auVar131 = vfmsub213ps_fma(ZEXT1632(auVar131),auVar272,auVar353);
              auVar131 = vfnmadd132ps_fma(ZEXT1632(auVar131),auVar272,auVar272);
              auVar131 = vfnmadd213ps_fma(ZEXT1632(auVar131),auVar264,auVar347);
              auVar110 = ZEXT1628(auVar131);
              goto LAB_002ef179;
            case 6:
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar127._4_4_ = uVar2;
              auVar127._0_4_ = uVar2;
              auVar127._8_4_ = uVar2;
              auVar127._12_4_ = uVar2;
              auVar127._16_4_ = uVar2;
              auVar127._20_4_ = uVar2;
              auVar127._24_4_ = uVar2;
              auVar127._28_4_ = uVar2;
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar182._4_4_ = uVar2;
              auVar182._0_4_ = uVar2;
              auVar182._8_4_ = uVar2;
              auVar182._12_4_ = uVar2;
              auVar182._16_4_ = uVar2;
              auVar182._20_4_ = uVar2;
              auVar182._24_4_ = uVar2;
              auVar182._28_4_ = uVar2;
              auVar131 = vfmadd231ps_fma(auVar182,auVar88,auVar127);
              auVar272 = vmaxps_avx(ZEXT1632(auVar131),_DAT_0059a1e0);
              auVar183._8_4_ = 0x3f800000;
              auVar183._0_8_ = 0x3f8000003f800000;
              auVar183._12_4_ = 0x3f800000;
              auVar183._16_4_ = 0x3f800000;
              auVar183._20_4_ = 0x3f800000;
              auVar183._24_4_ = 0x3f800000;
              auVar183._28_4_ = 0x3f800000;
              auVar272 = vminps_avx(auVar272,auVar183);
              auVar110 = auVar272._0_28_;
LAB_002ef179:
              auVar88._4_4_ = auVar110._4_4_ * fVar129;
              auVar88._0_4_ = auVar110._0_4_ * fVar94;
              auVar88._8_4_ = auVar110._8_4_ * auVar88._8_4_;
              auVar88._12_4_ = auVar110._12_4_ * auVar88._12_4_;
              auVar88._16_4_ = auVar110._16_4_ * auVar88._16_4_;
              auVar88._20_4_ = auVar110._20_4_ * auVar88._20_4_;
              auVar88._24_4_ = auVar110._24_4_ * auVar88._24_4_;
            }
            *(undefined1 (*) [32])((long)top_blob->data + uVar34 * 0x20) = auVar88;
            uVar34 = local_2f8 + 1;
            lVar44 = local_2c0 + 8;
            lVar39 = local_2c8 + 8;
            lVar41 = local_2d0 + 8;
            lVar42 = local_2d8 + 8;
            lVar45 = local_2e0 + 8;
            lVar35 = local_2e8 + 8;
            lVar55 = local_2f0 + 8;
            local_300 = local_300 + 8;
          } while (uVar34 != local_220);
        }
        auVar131 = local_278;
        local_238 = (ulong)(int)uVar32;
        uVar34 = local_238 & 0xfffffffffffffff8;
        fVar94 = (float)(uVar32 >> 2 & 1);
        if ((uVar32 >> 2 & 1) != 0) {
          uStack_284 = 0;
          if (lVar21 == 0) {
            auVar186 = ZEXT816(0) << 0x40;
          }
          else {
            auVar186 = *(undefined1 (*) [16])(lVar21 + uVar34 * 4);
          }
          pvVar22 = (this->weight_data_tm).data;
          lVar44 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
          pauVar57 = (undefined1 (*) [16])(lVar44 * uVar34 + (long)pvVar22);
          pauVar54 = (undefined1 (*) [16])((uVar34 | 1) * lVar44 + (long)pvVar22);
          pauVar56 = (undefined1 (*) [16])((uVar34 | 2) * lVar44 + (long)pvVar22);
          pauVar38 = (undefined1 (*) [16])((uVar34 | 3) * lVar44 + (long)pvVar22);
          pauVar40 = local_3b8;
          if ((int)uVar53 < 8) {
            uVar30 = 0;
            local_1b8 = SUB6432(ZEXT864(0),0);
            local_1f8 = SUB6432(ZEXT864(0),0);
            local_1d8 = SUB6432(ZEXT864(0),0);
            local_198 = SUB6432(ZEXT864(0),0);
          }
          else {
            uVar30 = uVar53 & 0xfffffff8;
            auVar288 = ZEXT864(0);
            iVar43 = 7;
            auVar184 = ZEXT864(0);
            auVar211 = ZEXT864(0);
            auVar128 = ZEXT864(0);
            do {
              auVar272 = *pauVar40;
              auVar215 = vlddqu_avx(*pauVar57);
              auVar90 = vcvtph2ps_f16c(auVar215);
              auVar215 = vlddqu_avx(*pauVar54);
              auVar77 = vcvtph2ps_f16c(auVar215);
              auVar215 = vlddqu_avx(*pauVar56);
              auVar88 = vcvtph2ps_f16c(auVar215);
              auVar215 = vlddqu_avx(*pauVar38);
              auVar127 = vcvtph2ps_f16c(auVar215);
              auVar215 = vfmadd231ps_fma(auVar128._0_32_,auVar272,auVar90);
              auVar128 = ZEXT1664(auVar215);
              local_1b8 = ZEXT1632(auVar215);
              auVar215 = vfmadd231ps_fma(auVar211._0_32_,auVar272,auVar77);
              auVar211 = ZEXT1664(auVar215);
              local_1f8 = ZEXT1632(auVar215);
              auVar215 = vfmadd231ps_fma(auVar184._0_32_,auVar272,auVar88);
              auVar184 = ZEXT1664(auVar215);
              local_1d8 = ZEXT1632(auVar215);
              auVar215 = vfmadd231ps_fma(auVar288._0_32_,auVar272,auVar127);
              auVar288 = ZEXT1664(auVar215);
              local_198 = ZEXT1632(auVar215);
              pauVar40 = pauVar40 + 1;
              pauVar57 = pauVar57 + 1;
              pauVar54 = pauVar54 + 1;
              pauVar56 = pauVar56 + 1;
              pauVar38 = pauVar38 + 1;
              iVar43 = iVar43 + 8;
            } while (iVar43 < (int)uVar53);
          }
          local_348 = ZEXT816(0) << 0x40;
          if ((int)(uVar30 | 3) < (int)uVar53) {
            local_298 = ZEXT816(0);
            lVar44 = 0;
            auVar288 = ZEXT864(0);
            local_368 = ZEXT816(0);
            pauVar36 = pauVar40;
            uVar48 = uVar30;
            do {
              auVar215._8_8_ = 0;
              auVar215._0_8_ = *(ulong *)(*pauVar57 + lVar44);
              auVar99 = vcvtph2ps_f16c(auVar215);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)(*pauVar54 + lVar44);
              auVar268 = vcvtph2ps_f16c(auVar14);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *(ulong *)(*pauVar56 + lVar44);
              auVar291 = vcvtph2ps_f16c(auVar15);
              auVar215 = *(undefined1 (*) [16])(*pauVar40 + lVar44 * 2);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = *(ulong *)(*pauVar38 + lVar44);
              auVar67 = vcvtph2ps_f16c(auVar16);
              local_348 = vfmadd231ps_fma(local_348,auVar215,auVar99);
              local_368 = vfmadd231ps_fma(local_368,auVar215,auVar268);
              local_358 = vfmadd231ps_fma(auVar288._0_16_,auVar215,auVar291);
              auVar288 = ZEXT1664(local_358);
              local_298 = vfmadd231ps_fma(local_298,auVar215,auVar67);
              pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
              uVar30 = uVar48 + 4;
              iVar43 = uVar48 + 7;
              lVar44 = lVar44 + 8;
              uVar48 = uVar30;
            } while (iVar43 < (int)uVar53);
            pauVar38 = (undefined1 (*) [16])(*pauVar38 + lVar44);
            pauVar56 = (undefined1 (*) [16])(*pauVar56 + lVar44);
            pauVar54 = (undefined1 (*) [16])(*pauVar54 + lVar44);
            pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar44);
            pauVar40 = pauVar36;
          }
          else {
            local_368 = ZEXT816(0);
            local_358 = SUB6416(ZEXT864(0),0);
            local_298 = ZEXT816(0);
          }
          local_278._4_4_ = 0;
          local_278._0_4_ = uVar53 - uVar30;
          local_278._8_8_ = auVar131._8_8_;
          local_288 = fVar94;
          if (uVar53 - uVar30 != 0 && (int)uVar30 <= (int)uVar53) {
            lVar44 = 0;
            do {
              local_2b8._0_16_ = auVar186;
              local_318 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              fVar94 = float16_to_float32(*(unsigned_short *)(*pauVar57 + lVar44 * 2));
              auVar272 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db_06;
              local_218._0_4_ = fVar94;
              fStack_210 = (float)extraout_XMM0_Dc_05;
              _fStack_208 = auVar272._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd_05;
              _local_328 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              local_338._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar54 + lVar44 * 2));
              local_338._4_4_ = extraout_XMM0_Db_07;
              local_338._8_4_ = extraout_XMM0_Dc_06;
              local_338._12_4_ = extraout_XMM0_Dd_06;
              local_248 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar56 + lVar44 * 2));
              local_258._4_4_ = extraout_XMM0_Db_08;
              local_258._8_4_ = extraout_XMM0_Dc_07;
              local_258._12_4_ = extraout_XMM0_Dd_07;
              local_268 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              auVar128._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar38 + lVar44 * 2));
              auVar128._4_60_ = extraout_var_00;
              auVar131 = vinsertps_avx(_local_218,ZEXT416((uint)local_338._0_4_),0x10);
              auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_258._0_4_),0x20);
              auVar131 = vinsertps_avx(auVar131,auVar128._0_16_,0x30);
              auVar186 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
              auVar186 = vinsertps_avx(auVar186,ZEXT416((uint)local_248._0_4_),0x20);
              auVar186 = vinsertps_avx(auVar186,ZEXT416((uint)local_268._0_4_),0x30);
              auVar186 = vfmadd231ps_fma(local_2b8._0_16_,auVar131,auVar186);
              lVar44 = lVar44 + 1;
            } while (local_278._0_4_ != (int)lVar44);
          }
          auVar272 = vhaddps_avx(local_1b8,local_1f8);
          auVar90 = vhaddps_avx(local_1d8,local_198);
          auVar272 = vhaddps_avx(auVar272,auVar90);
          auVar215 = vunpcklps_avx(local_348,local_368);
          auVar99 = vunpcklps_avx(local_358,local_298);
          auVar268 = vunpckhps_avx(local_348,local_368);
          auVar291 = vunpckhps_avx(local_358,local_298);
          auVar131 = vmovlhps_avx(auVar215,auVar99);
          auVar99 = vunpckhpd_avx(auVar215,auVar99);
          auVar215 = vmovlhps_avx(auVar268,auVar291);
          auVar268 = vunpckhpd_avx(auVar268,auVar291);
          auVar68._0_4_ =
               auVar99._0_4_ + auVar131._0_4_ + auVar215._0_4_ + auVar268._0_4_ +
               auVar186._0_4_ + auVar272._0_4_ + auVar272._16_4_;
          auVar68._4_4_ =
               auVar99._4_4_ + auVar131._4_4_ + auVar215._4_4_ + auVar268._4_4_ +
               auVar186._4_4_ + auVar272._4_4_ + auVar272._20_4_;
          auVar68._8_4_ =
               auVar99._8_4_ + auVar131._8_4_ + auVar215._8_4_ + auVar268._8_4_ +
               auVar186._8_4_ + auVar272._8_4_ + auVar272._24_4_;
          auVar68._12_4_ =
               auVar99._12_4_ + auVar131._12_4_ + auVar215._12_4_ + auVar268._12_4_ +
               auVar186._12_4_ + auVar272._12_4_ + auVar272._28_4_;
          switch(uVar18) {
          case 1:
            auVar68 = vmaxps_avx(auVar68,ZEXT816(0) << 0x20);
            break;
          case 2:
            auVar131 = vmaxps_avx(auVar68,ZEXT816(0) << 0x20);
            auVar186 = vminps_avx(auVar68,ZEXT816(0) << 0x20);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar72._4_4_ = uVar2;
            auVar72._0_4_ = uVar2;
            auVar72._8_4_ = uVar2;
            auVar72._12_4_ = uVar2;
            auVar68 = vfmadd213ps_fma(auVar72,auVar186,auVar131);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar103._4_4_ = uVar2;
            auVar103._0_4_ = uVar2;
            auVar103._8_4_ = uVar2;
            auVar103._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
            auVar153._4_4_ = uVar2;
            auVar153._0_4_ = uVar2;
            auVar153._8_4_ = uVar2;
            auVar153._12_4_ = uVar2;
            auVar131 = vmaxps_avx(auVar68,auVar103);
            auVar68 = vminps_avx(auVar131,auVar153);
            break;
          case 4:
            uVar1 = CONCAT44(auVar68._4_4_,auVar68._0_4_);
            auVar69._0_8_ = uVar1 ^ 0x8000000080000000;
            auVar69._8_4_ = -auVar68._8_4_;
            auVar69._12_4_ = -auVar68._12_4_;
            auVar104._8_4_ = 0x42b0c0a5;
            auVar104._0_8_ = 0x42b0c0a542b0c0a5;
            auVar104._12_4_ = 0x42b0c0a5;
            auVar131 = vminps_avx(auVar69,auVar104);
            auVar105._8_4_ = 0xc2b0c0a5;
            auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar105._12_4_ = 0xc2b0c0a5;
            auVar215 = vmaxps_avx(auVar131,auVar105);
            auVar106._8_4_ = 0x3fb8aa3b;
            auVar106._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar106._12_4_ = 0x3fb8aa3b;
            auVar154._8_4_ = 0x3f000000;
            auVar154._0_8_ = 0x3f0000003f000000;
            auVar154._12_4_ = 0x3f000000;
            auVar131 = vfmadd213ps_fma(auVar106,auVar215,auVar154);
            auVar201._0_4_ = (int)auVar131._0_4_;
            auVar201._4_4_ = (int)auVar131._4_4_;
            auVar201._8_4_ = (int)auVar131._8_4_;
            auVar201._12_4_ = (int)auVar131._12_4_;
            auVar186 = vcvtdq2ps_avx(auVar201);
            auVar131 = vcmpps_avx(auVar131,auVar186,1);
            auVar107._8_4_ = 0x3f800000;
            auVar107._0_8_ = 0x3f8000003f800000;
            auVar107._12_4_ = 0x3f800000;
            auVar131 = vandps_avx(auVar131,auVar107);
            auVar131 = vsubps_avx(auVar186,auVar131);
            auVar233._8_4_ = 0x3f318000;
            auVar233._0_8_ = 0x3f3180003f318000;
            auVar233._12_4_ = 0x3f318000;
            auVar186 = vfmsub213ps_fma(auVar233,auVar131,auVar215);
            auVar70._8_4_ = 0x395e8083;
            auVar70._0_8_ = 0x395e8083395e8083;
            auVar70._12_4_ = 0x395e8083;
            auVar215 = vfmsub213ps_fma(auVar70,auVar131,auVar186);
            auVar234._0_4_ = auVar215._0_4_ * auVar215._0_4_;
            auVar234._4_4_ = auVar215._4_4_ * auVar215._4_4_;
            auVar234._8_4_ = auVar215._8_4_ * auVar215._8_4_;
            auVar234._12_4_ = auVar215._12_4_ * auVar215._12_4_;
            auVar247._8_4_ = 0x3ab743ce;
            auVar247._0_8_ = 0x3ab743ce3ab743ce;
            auVar247._12_4_ = 0x3ab743ce;
            auVar270._8_4_ = 0x39506967;
            auVar270._0_8_ = 0x3950696739506967;
            auVar270._12_4_ = 0x39506967;
            auVar186 = vfmadd213ps_fma(auVar270,auVar215,auVar247);
            auVar248._8_4_ = 0x3c088908;
            auVar248._0_8_ = 0x3c0889083c088908;
            auVar248._12_4_ = 0x3c088908;
            auVar186 = vfmadd231ps_fma(auVar248,auVar215,auVar186);
            auVar271._8_4_ = 0x3d2aa9c1;
            auVar271._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar271._12_4_ = 0x3d2aa9c1;
            auVar186 = vfmadd231ps_fma(auVar271,auVar215,auVar186);
            auVar249._8_4_ = 0x3e2aaaaa;
            auVar249._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar249._12_4_ = 0x3e2aaaaa;
            auVar186 = vfmadd231ps_fma(auVar249,auVar215,auVar186);
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar154);
            auVar186 = vfmadd213ps_fma(auVar186,auVar234,auVar215);
            auVar155._0_4_ = auVar186._0_4_ + 1.0;
            auVar155._4_4_ = auVar186._4_4_ + 1.0;
            auVar155._8_4_ = auVar186._8_4_ + 1.0;
            auVar155._12_4_ = auVar186._12_4_ + 1.0;
            auVar71._0_4_ = (int)auVar131._0_4_;
            auVar71._4_4_ = (int)auVar131._4_4_;
            auVar71._8_4_ = (int)auVar131._8_4_;
            auVar71._12_4_ = (int)auVar131._12_4_;
            auVar131 = vpslld_avx(auVar71,0x17);
            auVar131 = vpaddd_avx(auVar131,auVar107);
            auVar186 = vfmadd213ps_fma(auVar131,auVar155,auVar107);
            auVar131 = vrcpps_avx(auVar186);
            auVar186 = vfmsub213ps_fma(auVar186,auVar131,auVar107);
            auVar68 = vfnmadd132ps_fma(auVar186,auVar131,auVar131);
            break;
          case 5:
            auVar100._8_4_ = 0x42b0c0a5;
            auVar100._0_8_ = 0x42b0c0a542b0c0a5;
            auVar100._12_4_ = 0x42b0c0a5;
            auVar131 = vminps_avx(auVar68,auVar100);
            auVar141._8_4_ = 0xc2b0c0a5;
            auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar141._12_4_ = 0xc2b0c0a5;
            auVar215 = vmaxps_avx(auVar131,auVar141);
            auVar246._8_4_ = 0x3fb8aa3b;
            auVar246._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar246._12_4_ = 0x3fb8aa3b;
            auVar292._8_4_ = 0x3f000000;
            auVar292._0_8_ = 0x3f0000003f000000;
            auVar292._12_4_ = 0x3f000000;
            auVar131 = vfmadd213ps_fma(auVar246,auVar215,auVar292);
            auVar198._0_4_ = (int)auVar131._0_4_;
            auVar198._4_4_ = (int)auVar131._4_4_;
            auVar198._8_4_ = (int)auVar131._8_4_;
            auVar198._12_4_ = (int)auVar131._12_4_;
            auVar186 = vcvtdq2ps_avx(auVar198);
            auVar131 = vcmpps_avx(auVar131,auVar186,1);
            auVar269._8_4_ = 0x3f800000;
            auVar269._0_8_ = 0x3f8000003f800000;
            auVar269._12_4_ = 0x3f800000;
            auVar131 = vandps_avx(auVar131,auVar269);
            auVar131 = vsubps_avx(auVar186,auVar131);
            auVar199._8_4_ = 0x3f318000;
            auVar199._0_8_ = 0x3f3180003f318000;
            auVar199._12_4_ = 0x3f318000;
            auVar186 = vfmsub231ps_fma(auVar215,auVar131,auVar199);
            auVar313._8_4_ = 0xb95e8083;
            auVar313._0_8_ = 0xb95e8083b95e8083;
            auVar313._12_4_ = 0xb95e8083;
            auVar215 = vfnmsub231ps_fma(auVar186,auVar131,auVar313);
            auVar374._0_4_ = auVar215._0_4_ * auVar215._0_4_;
            auVar374._4_4_ = auVar215._4_4_ * auVar215._4_4_;
            auVar374._8_4_ = auVar215._8_4_ * auVar215._8_4_;
            auVar374._12_4_ = auVar215._12_4_ * auVar215._12_4_;
            auVar142._8_4_ = 0x3ab743ce;
            auVar142._0_8_ = 0x3ab743ce3ab743ce;
            auVar142._12_4_ = 0x3ab743ce;
            auVar101._8_4_ = 0x39506967;
            auVar101._0_8_ = 0x3950696739506967;
            auVar101._12_4_ = 0x39506967;
            auVar186 = vfmadd213ps_fma(auVar101,auVar215,auVar142);
            auVar344._8_4_ = 0x3c088908;
            auVar344._0_8_ = 0x3c0889083c088908;
            auVar344._12_4_ = 0x3c088908;
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar344);
            auVar350._8_4_ = 0x3d2aa9c1;
            auVar350._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar350._12_4_ = 0x3d2aa9c1;
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar350);
            auVar356._8_4_ = 0x3e2aaaaa;
            auVar356._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar356._12_4_ = 0x3e2aaaaa;
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar356);
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar292);
            auVar186 = vfmadd213ps_fma(auVar186,auVar374,auVar215);
            auVar221._0_4_ = auVar186._0_4_ + 1.0;
            auVar221._4_4_ = auVar186._4_4_ + 1.0;
            auVar221._8_4_ = auVar186._8_4_ + 1.0;
            auVar221._12_4_ = auVar186._12_4_ + 1.0;
            auVar367._0_4_ = (int)auVar131._0_4_;
            auVar367._4_4_ = (int)auVar131._4_4_;
            auVar367._8_4_ = (int)auVar131._8_4_;
            auVar367._12_4_ = (int)auVar131._12_4_;
            auVar131 = vpslld_avx(auVar367,0x17);
            auVar131 = vpaddd_avx(auVar131,auVar269);
            auVar131 = vfmadd213ps_fma(auVar131,auVar221,auVar269);
            auVar186 = vcmpps_avx(auVar131,ZEXT816(0) << 0x40,2);
            auVar222._8_4_ = 0x800000;
            auVar222._0_8_ = 0x80000000800000;
            auVar222._12_4_ = 0x800000;
            auVar131 = vmaxps_avx(auVar131,auVar222);
            auVar215 = vpsrld_avx(auVar131,0x17);
            auVar375._8_4_ = 0x807fffff;
            auVar375._0_8_ = 0x807fffff807fffff;
            auVar375._12_4_ = 0x807fffff;
            auVar131 = vandps_avx(auVar375,auVar131);
            auVar99 = vorps_avx(auVar131,auVar292);
            auVar376._8_4_ = 0xffffff82;
            auVar376._0_8_ = 0xffffff82ffffff82;
            auVar376._12_4_ = 0xffffff82;
            auVar268 = vpaddd_avx(auVar215,auVar376);
            auVar368._8_4_ = 0x3f3504f3;
            auVar368._0_8_ = 0x3f3504f33f3504f3;
            auVar368._12_4_ = 0x3f3504f3;
            auVar215 = vcmpps_avx(auVar99,auVar368,1);
            auVar131 = vandps_avx(auVar215,auVar99);
            auVar369._0_4_ = auVar99._0_4_ + -1.0 + auVar131._0_4_;
            auVar369._4_4_ = auVar99._4_4_ + -1.0 + auVar131._4_4_;
            auVar369._8_4_ = auVar99._8_4_ + -1.0 + auVar131._8_4_;
            auVar369._12_4_ = auVar99._12_4_ + -1.0 + auVar131._12_4_;
            auVar99 = vcvtdq2ps_avx(auVar268);
            auVar131 = vandps_avx(auVar215,auVar269);
            auVar131 = vsubps_avx(auVar99,auVar131);
            auVar143._8_4_ = 0xbdebd1b8;
            auVar143._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar143._12_4_ = 0xbdebd1b8;
            auVar223._8_4_ = 0x3d9021bb;
            auVar223._0_8_ = 0x3d9021bb3d9021bb;
            auVar223._12_4_ = 0x3d9021bb;
            auVar215 = vfmadd213ps_fma(auVar223,auVar369,auVar143);
            auVar144._8_4_ = 0x3def251a;
            auVar144._0_8_ = 0x3def251a3def251a;
            auVar144._12_4_ = 0x3def251a;
            auVar215 = vfmadd231ps_fma(auVar144,auVar369,auVar215);
            auVar224._8_4_ = 0xbdfe5d4f;
            auVar224._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar224._12_4_ = 0xbdfe5d4f;
            auVar215 = vfmadd231ps_fma(auVar224,auVar369,auVar215);
            auVar145._8_4_ = 0x3e11e9bf;
            auVar145._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar145._12_4_ = 0x3e11e9bf;
            auVar215 = vfmadd231ps_fma(auVar145,auVar369,auVar215);
            auVar225._8_4_ = 0xbe2aae50;
            auVar225._0_8_ = 0xbe2aae50be2aae50;
            auVar225._12_4_ = 0xbe2aae50;
            auVar215 = vfmadd231ps_fma(auVar225,auVar369,auVar215);
            auVar146._8_4_ = 0x3e4cceac;
            auVar146._0_8_ = 0x3e4cceac3e4cceac;
            auVar146._12_4_ = 0x3e4cceac;
            auVar215 = vfmadd231ps_fma(auVar146,auVar369,auVar215);
            auVar226._8_4_ = 0xbe7ffffc;
            auVar226._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar226._12_4_ = 0xbe7ffffc;
            auVar215 = vfmadd231ps_fma(auVar226,auVar369,auVar215);
            auVar147._8_4_ = 0x3eaaaaaa;
            auVar147._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar147._12_4_ = 0x3eaaaaaa;
            auVar215 = vfmadd231ps_fma(auVar147,auVar369,auVar215);
            auVar227._0_4_ = auVar369._0_4_ * auVar369._0_4_;
            auVar227._4_4_ = auVar369._4_4_ * auVar369._4_4_;
            auVar227._8_4_ = auVar369._8_4_ * auVar369._8_4_;
            auVar227._12_4_ = auVar369._12_4_ * auVar369._12_4_;
            auVar148._0_4_ = auVar369._0_4_ * auVar227._0_4_ * auVar215._0_4_;
            auVar148._4_4_ = auVar369._4_4_ * auVar227._4_4_ * auVar215._4_4_;
            auVar148._8_4_ = auVar369._8_4_ * auVar227._8_4_ * auVar215._8_4_;
            auVar148._12_4_ = auVar369._12_4_ * auVar227._12_4_ * auVar215._12_4_;
            auVar215 = vfmadd231ps_fma(auVar148,auVar131,auVar313);
            auVar215 = vfmsub231ps_fma(auVar215,auVar292,auVar227);
            auVar215 = vsubps_avx(auVar215,auVar369);
            auVar131 = vfnmadd231ps_fma(auVar215,auVar199,auVar131);
            auVar149._0_4_ = auVar131._0_4_ + auVar131._0_4_;
            auVar149._4_4_ = auVar131._4_4_ + auVar131._4_4_;
            auVar149._8_4_ = auVar131._8_4_ + auVar131._8_4_;
            auVar149._12_4_ = auVar131._12_4_ + auVar131._12_4_;
            auVar228._8_4_ = 0x7fffffff;
            auVar228._0_8_ = 0x7fffffff7fffffff;
            auVar228._12_4_ = 0x7fffffff;
            auVar131 = vblendvps_avx(auVar149,auVar228,auVar186);
            auVar229._8_4_ = 0x42b0c0a5;
            auVar229._0_8_ = 0x42b0c0a542b0c0a5;
            auVar229._12_4_ = 0x42b0c0a5;
            auVar131 = vminps_avx(auVar131,auVar229);
            auVar230._8_4_ = 0xc2b0c0a5;
            auVar230._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar230._12_4_ = 0xc2b0c0a5;
            auVar215 = vmaxps_avx(auVar131,auVar230);
            auVar131 = vfmadd213ps_fma(auVar246,auVar215,auVar292);
            auVar231._0_4_ = (int)auVar131._0_4_;
            auVar231._4_4_ = (int)auVar131._4_4_;
            auVar231._8_4_ = (int)auVar131._8_4_;
            auVar231._12_4_ = (int)auVar131._12_4_;
            auVar186 = vcvtdq2ps_avx(auVar231);
            auVar131 = vcmpps_avx(auVar131,auVar186,1);
            auVar131 = vandps_avx(auVar131,auVar269);
            auVar131 = vsubps_avx(auVar186,auVar131);
            auVar186 = vfmsub213ps_fma(auVar199,auVar131,auVar215);
            auVar215 = vfnmsub231ps_fma(auVar186,auVar131,auVar313);
            auVar150._8_4_ = 0x3ab743ce;
            auVar150._0_8_ = 0x3ab743ce3ab743ce;
            auVar150._12_4_ = 0x3ab743ce;
            auVar186 = vfmadd213ps_fma(auVar101,auVar215,auVar150);
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar344);
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar350);
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar356);
            auVar186 = vfmadd213ps_fma(auVar186,auVar215,auVar292);
            auVar151._0_4_ = auVar215._0_4_ * auVar215._0_4_;
            auVar151._4_4_ = auVar215._4_4_ * auVar215._4_4_;
            auVar151._8_4_ = auVar215._8_4_ * auVar215._8_4_;
            auVar151._12_4_ = auVar215._12_4_ * auVar215._12_4_;
            auVar186 = vfmadd213ps_fma(auVar186,auVar151,auVar215);
            auVar102._0_4_ = auVar186._0_4_ + 1.0;
            auVar102._4_4_ = auVar186._4_4_ + 1.0;
            auVar102._8_4_ = auVar186._8_4_ + 1.0;
            auVar102._12_4_ = auVar186._12_4_ + 1.0;
            auVar152._0_4_ = (int)auVar131._0_4_;
            auVar152._4_4_ = (int)auVar131._4_4_;
            auVar152._8_4_ = (int)auVar131._8_4_;
            auVar152._12_4_ = (int)auVar131._12_4_;
            auVar131 = vpslld_avx(auVar152,0x17);
            auVar131 = vpaddd_avx(auVar131,auVar269);
            auVar186 = vfmadd213ps_fma(auVar131,auVar102,auVar269);
            auVar131 = vrcpps_avx(auVar186);
            auVar200._0_4_ = auVar131._0_4_ + auVar131._0_4_;
            auVar200._4_4_ = auVar131._4_4_ + auVar131._4_4_;
            auVar200._8_4_ = auVar131._8_4_ + auVar131._8_4_;
            auVar200._12_4_ = auVar131._12_4_ + auVar131._12_4_;
            auVar232._8_4_ = 0x40000000;
            auVar232._0_8_ = 0x4000000040000000;
            auVar232._12_4_ = 0x40000000;
            auVar186 = vfmsub231ps_fma(auVar232,auVar200,auVar186);
            auVar131 = vfnmadd213ps_fma(auVar186,auVar131,auVar200);
            auVar68 = vfmsub231ps_fma(auVar68,auVar68,auVar131);
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar108._4_4_ = uVar2;
            auVar108._0_4_ = uVar2;
            auVar108._8_4_ = uVar2;
            auVar108._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
            auVar156._4_4_ = uVar2;
            auVar156._0_4_ = uVar2;
            auVar156._8_4_ = uVar2;
            auVar156._12_4_ = uVar2;
            auVar131 = vfmadd231ps_fma(auVar156,auVar68,auVar108);
            auVar131 = vmaxps_avx(auVar131,ZEXT416(0) << 0x20);
            auVar157._8_4_ = 0x3f800000;
            auVar157._0_8_ = 0x3f8000003f800000;
            auVar157._12_4_ = 0x3f800000;
            auVar131 = vminps_avx(auVar131,auVar157);
            auVar68._0_4_ = auVar131._0_4_ * auVar68._0_4_;
            auVar68._4_4_ = auVar131._4_4_ * auVar68._4_4_;
            auVar68._8_4_ = auVar131._8_4_ * auVar68._8_4_;
            auVar68._12_4_ = auVar131._12_4_ * auVar68._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar34 * 4) = auVar68;
          fVar94 = local_288;
        }
        iVar31 = (int)uVar34 + (int)fVar94 * 4;
        iVar43 = 0;
        if (iVar31 < (int)uVar32) {
          local_338._0_4_ = uVar53 & 0xfffffff8;
          uVar34 = (ulong)iVar31;
          do {
            auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
            if (lVar21 != 0) {
              auVar288 = ZEXT464(*(uint *)(lVar21 + uVar34 * 4));
            }
            fVar94 = auVar288._0_4_;
            pauVar38 = (undefined1 (*) [16])
                       ((long)(this->weight_data_tm).w * uVar34 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
            pauVar40 = local_3b8;
            if ((int)uVar53 < 8) {
              uVar32 = 0;
              _local_218 = SUB6432(ZEXT864(0),0);
            }
            else {
              auVar128 = ZEXT864(0);
              iVar43 = 7;
              do {
                auVar131 = vlddqu_avx(*pauVar38);
                auVar272 = vcvtph2ps_f16c(auVar131);
                auVar131 = vfmadd231ps_fma(auVar128._0_32_,auVar272,*pauVar40);
                auVar128 = ZEXT1664(auVar131);
                _local_218 = ZEXT1632(auVar131);
                pauVar40 = pauVar40 + 1;
                pauVar38 = pauVar38 + 1;
                iVar43 = iVar43 + 8;
              } while (iVar43 < (int)uVar53);
              uVar32 = local_338._0_4_;
            }
            _local_328 = ZEXT816(0) << 0x40;
            uVar30 = uVar32 | 3;
            while ((int)uVar30 < (int)uVar53) {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = *(ulong *)*pauVar38;
              auVar131 = vcvtph2ps_f16c(auVar17);
              _local_328 = vfmadd231ps_fma(_local_328,auVar131,*(undefined1 (*) [16])*pauVar40);
              pauVar40 = (undefined1 (*) [32])(*pauVar40 + 0x10);
              pauVar38 = (undefined1 (*) [16])(*pauVar38 + 8);
              uVar30 = uVar32 + 7;
              uVar32 = uVar32 + 4;
            }
            if ((int)uVar32 < (int)uVar53) {
              lVar44 = 0;
              do {
                local_2b8._0_4_ = auVar288._0_4_;
                local_318._0_4_ = *(undefined4 *)(*pauVar40 + lVar44 * 4);
                auVar184._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar38 + lVar44 * 2));
                auVar184._4_60_ = extraout_var_01;
                auVar131 = vfmadd231ss_fma(ZEXT416((uint)local_2b8._0_4_),auVar184._0_16_,
                                           ZEXT416((uint)local_318._0_4_));
                fVar94 = auVar131._0_4_;
                auVar288 = ZEXT1664(auVar131);
                lVar44 = lVar44 + 1;
              } while (uVar53 - uVar32 != (int)lVar44);
            }
            auVar73._0_4_ = (float)local_218._0_4_ + (float)local_328._0_4_ + fStack_208;
            auVar73._4_4_ = (float)local_218._4_4_ + (float)local_328._4_4_ + fStack_204;
            auVar73._8_4_ = fStack_210 + fStack_320 + fStack_200;
            auVar73._12_4_ = fStack_20c + fStack_31c + fStack_1fc;
            auVar131 = vhaddps_avx(auVar73,auVar73);
            auVar131 = vhaddps_avx(auVar131,auVar131);
            fVar94 = auVar131._0_4_ + fVar94;
            auVar131 = ZEXT416((uint)fVar94);
            fVar129 = fVar94;
            switch(uVar18) {
            case 1:
              auVar131 = vmaxss_avx(auVar131,ZEXT416(0));
              fVar129 = auVar131._0_4_;
              break;
            case 2:
              auVar131 = vcmpss_avx(ZEXT816(0) << 0x20,auVar131,1);
              auVar159._8_4_ = 0x3f800000;
              auVar159._0_8_ = 0x3f8000003f800000;
              auVar159._12_4_ = 0x3f800000;
              auVar131 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var19)),
                                       auVar159,auVar131);
              fVar129 = auVar131._0_4_ * fVar94;
              break;
            case 3:
              fVar94 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar131 = vmaxss_avx(auVar131,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var19))
                                   );
              fVar129 = auVar131._0_4_;
              if (fVar94 < auVar131._0_4_) {
                fVar129 = fVar94;
              }
              break;
            case 4:
              auVar131 = vminss_avx(auVar131,ZEXT416(0x42b0c0a5));
              auVar109._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
              auVar109._8_4_ = auVar131._8_4_ ^ 0x80000000;
              auVar109._12_4_ = auVar131._12_4_ ^ 0x80000000;
              auVar131 = vcmpss_avx(auVar131,ZEXT416(0xc2b0c0a5),1);
              auVar158._8_4_ = 0x42b0c0a5;
              auVar158._0_8_ = 0x42b0c0a542b0c0a5;
              auVar158._12_4_ = 0x42b0c0a5;
              auVar131 = vblendvps_avx(auVar109,auVar158,auVar131);
              fVar94 = expf(auVar131._0_4_);
              fVar129 = 1.0 / (fVar94 + 1.0);
              break;
            case 5:
              local_2b8._0_4_ = fVar94;
              fVar94 = expf(fVar94);
              fVar94 = logf(fVar94 + 1.0);
              fVar129 = tanhf(fVar94);
              fVar129 = fVar129 * (float)local_2b8._0_4_;
              break;
            case 6:
              fVar307 = **(float **)(&this->field_0xe8 + (long)p_Var19);
              fVar319 = (*(float **)(&this->field_0xe8 + (long)p_Var19))[1];
              fVar185 = -fVar319 / fVar307;
              fVar129 = 0.0;
              if ((fVar185 <= fVar94) && (fVar129 = fVar94, fVar94 <= fVar185 + 1.0 / fVar307)) {
                auVar131 = vfmadd213ss_fma(ZEXT416((uint)fVar307),auVar131,ZEXT416((uint)fVar319));
                fVar129 = auVar131._0_4_ * fVar94;
              }
            }
            *(float *)((long)top_blob->data + uVar34 * 4) = fVar129;
            uVar34 = uVar34 + 1;
          } while (uVar34 != local_238);
          iVar43 = 0;
        }
      }
      else if (iVar31 == 4) {
        if (0 < (int)uVar32) {
          uVar34 = 0;
          auVar288 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
          do {
            auVar131 = ZEXT816(0) << 0x40;
            if (lVar21 != 0) {
              auVar131 = *(undefined1 (*) [16])(lVar21 + uVar34 * 0x10);
            }
            pauVar40 = (undefined1 (*) [32])
                       ((long)(this->weight_data_tm).w * uVar34 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
            pauVar36 = local_3b8;
            if ((int)uVar53 < 8) {
              auVar90 = SUB6432(ZEXT864(0),0);
              auVar272 = SUB6432(ZEXT864(0),0);
              auVar184 = ZEXT864(0);
              auVar128 = ZEXT864(0);
              uVar30 = 0;
            }
            else {
              auVar128 = ZEXT864(0);
              iVar43 = 7;
              auVar184 = ZEXT864(0);
              auVar211 = ZEXT864(0);
              auVar379 = ZEXT864(0);
              do {
                uVar2 = *(undefined4 *)*pauVar36;
                auVar239._4_4_ = uVar2;
                auVar239._0_4_ = uVar2;
                auVar239._8_4_ = uVar2;
                auVar239._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 4);
                auVar239._20_4_ = uVar2;
                auVar239._16_4_ = uVar2;
                auVar239._24_4_ = uVar2;
                auVar239._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 8);
                auVar332._4_4_ = uVar2;
                auVar332._0_4_ = uVar2;
                auVar332._8_4_ = uVar2;
                auVar332._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0xc);
                auVar332._20_4_ = uVar2;
                auVar332._16_4_ = uVar2;
                auVar332._24_4_ = uVar2;
                auVar332._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0x10);
                auVar352._4_4_ = uVar2;
                auVar352._0_4_ = uVar2;
                auVar352._8_4_ = uVar2;
                auVar352._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0x14);
                auVar352._20_4_ = uVar2;
                auVar352._16_4_ = uVar2;
                auVar352._24_4_ = uVar2;
                auVar352._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0x18);
                auVar358._4_4_ = uVar2;
                auVar358._0_4_ = uVar2;
                auVar358._8_4_ = uVar2;
                auVar358._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0x1c);
                auVar358._20_4_ = uVar2;
                auVar358._16_4_ = uVar2;
                auVar358._24_4_ = uVar2;
                auVar358._28_4_ = uVar2;
                auVar272 = vlddqu_avx(*pauVar40);
                auVar90 = vlddqu_avx(pauVar40[1]);
                auVar77 = vcvtph2ps_f16c(auVar272._0_16_);
                auVar186 = vfmadd231ps_fma(auVar128._0_32_,auVar239,auVar77);
                auVar128 = ZEXT1664(auVar186);
                auVar272 = vcvtph2ps_f16c(auVar272._16_16_);
                auVar186 = vfmadd231ps_fma(auVar184._0_32_,auVar332,auVar272);
                auVar184 = ZEXT1664(auVar186);
                auVar272 = vcvtph2ps_f16c(auVar90._0_16_);
                auVar186 = vfmadd231ps_fma(auVar211._0_32_,auVar352,auVar272);
                auVar211 = ZEXT1664(auVar186);
                auVar272 = ZEXT1632(auVar186);
                auVar90 = vcvtph2ps_f16c(auVar90._16_16_);
                auVar186 = vfmadd231ps_fma(auVar379._0_32_,auVar358,auVar90);
                auVar379 = ZEXT1664(auVar186);
                auVar90 = ZEXT1632(auVar186);
                pauVar36 = pauVar36 + 1;
                pauVar40 = pauVar40 + 2;
                iVar43 = iVar43 + 8;
                uVar30 = uVar53 & 0xfffffff8;
              } while (iVar43 < (int)uVar53);
            }
            auVar88 = auVar128._0_32_;
            auVar77 = auVar184._0_32_;
            uVar48 = uVar30 | 3;
            while ((int)uVar48 < (int)uVar53) {
              uVar2 = *(undefined4 *)*pauVar36;
              auVar240._4_4_ = uVar2;
              auVar240._0_4_ = uVar2;
              auVar240._8_4_ = uVar2;
              auVar240._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar36 + 4);
              auVar240._20_4_ = uVar2;
              auVar240._16_4_ = uVar2;
              auVar240._24_4_ = uVar2;
              auVar240._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar36 + 8);
              auVar333._4_4_ = uVar2;
              auVar333._0_4_ = uVar2;
              auVar333._8_4_ = uVar2;
              auVar333._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar36 + 0xc);
              auVar333._20_4_ = uVar2;
              auVar333._16_4_ = uVar2;
              auVar333._24_4_ = uVar2;
              auVar333._28_4_ = uVar2;
              auVar77 = vlddqu_avx(*pauVar40);
              auVar88 = vcvtph2ps_f16c(auVar77._0_16_);
              auVar186 = vfmadd231ps_fma(auVar128._0_32_,auVar240,auVar88);
              auVar128 = ZEXT1664(auVar186);
              auVar88 = ZEXT1632(auVar186);
              auVar77 = vcvtph2ps_f16c(auVar77._16_16_);
              auVar186 = vfmadd231ps_fma(auVar184._0_32_,auVar333,auVar77);
              auVar184 = ZEXT1664(auVar186);
              auVar77 = ZEXT1632(auVar186);
              pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
              pauVar40 = pauVar40 + 1;
              uVar48 = uVar30 + 7;
              uVar30 = uVar30 + 4;
            }
            if (uVar53 - uVar30 != 0 && (int)uVar30 <= (int)uVar53) {
              lVar44 = 0;
              do {
                auVar13._8_8_ = 0;
                auVar13._0_8_ = *(ulong *)(*pauVar40 + lVar44 * 8);
                auVar186 = vcvtph2ps_f16c(auVar13);
                uVar2 = *(undefined4 *)(*pauVar36 + lVar44 * 4);
                auVar326._4_4_ = uVar2;
                auVar326._0_4_ = uVar2;
                auVar326._8_4_ = uVar2;
                auVar326._12_4_ = uVar2;
                auVar131 = vfmadd231ps_fma(auVar131,auVar326,auVar186);
                lVar44 = lVar44 + 1;
              } while (uVar53 - uVar30 != (int)lVar44);
            }
            fVar94 = auVar90._4_4_ + auVar272._4_4_ + auVar77._4_4_ + auVar88._4_4_;
            auVar95._0_4_ =
                 auVar131._0_4_ +
                 auVar90._16_4_ + auVar272._16_4_ + auVar77._16_4_ + auVar88._16_4_ +
                 auVar90._0_4_ + auVar272._0_4_ + auVar77._0_4_ + auVar88._0_4_;
            auVar95._4_4_ = auVar131._4_4_ + fVar94 + fVar94;
            auVar95._8_4_ =
                 auVar131._8_4_ +
                 auVar90._24_4_ + auVar272._24_4_ + auVar77._24_4_ + auVar88._24_4_ +
                 auVar90._8_4_ + auVar272._8_4_ + auVar77._8_4_ + auVar88._8_4_;
            auVar95._12_4_ =
                 auVar131._12_4_ +
                 auVar90._28_4_ + auVar272._28_4_ + auVar77._28_4_ + auVar88._28_4_ +
                 auVar90._12_4_ + auVar272._12_4_ + auVar77._12_4_ + auVar88._12_4_;
            auVar131 = auVar288._0_16_;
            fVar94 = auVar288._0_4_;
            fVar129 = auVar288._4_4_;
            fVar307 = auVar288._8_4_;
            fVar319 = auVar288._12_4_;
            switch(uVar18) {
            case 1:
              auVar95 = vmaxps_avx(auVar95,_DAT_00595080);
              break;
            case 2:
              auVar131 = vmaxps_avx(auVar95,ZEXT816(0) << 0x40);
              auVar186 = vminps_avx(auVar95,ZEXT816(0) << 0x40);
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar98._4_4_ = uVar2;
              auVar98._0_4_ = uVar2;
              auVar98._8_4_ = uVar2;
              auVar98._12_4_ = uVar2;
              auVar95 = vfmadd213ps_fma(auVar98,auVar186,auVar131);
              break;
            case 3:
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar135._4_4_ = uVar2;
              auVar135._0_4_ = uVar2;
              auVar135._8_4_ = uVar2;
              auVar135._12_4_ = uVar2;
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar192._4_4_ = uVar2;
              auVar192._0_4_ = uVar2;
              auVar192._8_4_ = uVar2;
              auVar192._12_4_ = uVar2;
              auVar131 = vmaxps_avx(auVar95,auVar135);
              auVar95 = vminps_avx(auVar131,auVar192);
              break;
            case 4:
              uVar1 = CONCAT44(auVar95._4_4_,auVar95._0_4_);
              auVar96._0_8_ = uVar1 ^ 0x8000000080000000;
              auVar96._8_4_ = -auVar95._8_4_;
              auVar96._12_4_ = -auVar95._12_4_;
              auVar136._8_4_ = 0x42b0c0a5;
              auVar136._0_8_ = 0x42b0c0a542b0c0a5;
              auVar136._12_4_ = 0x42b0c0a5;
              auVar186 = vminps_avx(auVar96,auVar136);
              auVar137._8_4_ = 0xc2b0c0a5;
              auVar137._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar137._12_4_ = 0xc2b0c0a5;
              auVar99 = vmaxps_avx(auVar186,auVar137);
              auVar138._8_4_ = 0x3fb8aa3b;
              auVar138._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar138._12_4_ = 0x3fb8aa3b;
              auVar245._8_4_ = 0x3f000000;
              auVar245._0_8_ = 0x3f0000003f000000;
              auVar245._12_4_ = 0x3f000000;
              auVar186 = vfmadd213ps_fma(auVar138,auVar99,auVar245);
              auVar193._0_4_ = (int)auVar186._0_4_;
              auVar193._4_4_ = (int)auVar186._4_4_;
              auVar193._8_4_ = (int)auVar186._8_4_;
              auVar193._12_4_ = (int)auVar186._12_4_;
              auVar215 = vcvtdq2ps_avx(auVar193);
              auVar186 = vcmpps_avx(auVar186,auVar215,1);
              auVar186 = vandps_avx(auVar186,auVar131);
              auVar186 = vsubps_avx(auVar215,auVar186);
              auVar64._8_4_ = 0x3f318000;
              auVar64._0_8_ = 0x3f3180003f318000;
              auVar64._12_4_ = 0x3f318000;
              auVar215 = vfmsub231ps_fma(auVar99,auVar186,auVar64);
              auVar194._8_4_ = 0x395e8083;
              auVar194._0_8_ = 0x395e8083395e8083;
              auVar194._12_4_ = 0x395e8083;
              auVar99 = vfmsub231ps_fma(auVar215,auVar186,auVar194);
              auVar195._0_4_ = auVar99._0_4_ * auVar99._0_4_;
              auVar195._4_4_ = auVar99._4_4_ * auVar99._4_4_;
              auVar195._8_4_ = auVar99._8_4_ * auVar99._8_4_;
              auVar195._12_4_ = auVar99._12_4_ * auVar99._12_4_;
              auVar220._8_4_ = 0x39506967;
              auVar220._0_8_ = 0x3950696739506967;
              auVar220._12_4_ = 0x39506967;
              auVar312._8_4_ = 0x3ab743ce;
              auVar312._0_8_ = 0x3ab743ce3ab743ce;
              auVar312._12_4_ = 0x3ab743ce;
              auVar215 = vfmadd213ps_fma(auVar220,auVar99,auVar312);
              auVar290._8_4_ = 0x3c088908;
              auVar290._0_8_ = 0x3c0889083c088908;
              auVar290._12_4_ = 0x3c088908;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar290);
              auVar65._8_4_ = 0x3d2aa9c1;
              auVar65._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar65._12_4_ = 0x3d2aa9c1;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar65);
              auVar66._8_4_ = 0x3e2aaaaa;
              auVar66._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar66._12_4_ = 0x3e2aaaaa;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar66);
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar245);
              auVar215 = vfmadd213ps_fma(auVar215,auVar195,auVar99);
              auVar196._0_4_ = auVar215._0_4_ + fVar94;
              auVar196._4_4_ = auVar215._4_4_ + fVar129;
              auVar196._8_4_ = auVar215._8_4_ + fVar307;
              auVar196._12_4_ = auVar215._12_4_ + fVar319;
              auVar97._0_4_ = (int)auVar186._0_4_;
              auVar97._4_4_ = (int)auVar186._4_4_;
              auVar97._8_4_ = (int)auVar186._8_4_;
              auVar97._12_4_ = (int)auVar186._12_4_;
              auVar186 = vpslld_avx(auVar97,0x17);
              auVar186 = vpaddd_avx(auVar186,auVar131);
              auVar215 = vfmadd213ps_fma(auVar186,auVar196,auVar131);
              auVar186 = vrcpps_avx(auVar215);
              auVar131 = vfmsub213ps_fma(auVar215,auVar186,auVar131);
              auVar95 = vfnmadd132ps_fma(auVar131,auVar186,auVar186);
              break;
            case 5:
              auVar348._8_4_ = 0x42b0c0a5;
              auVar348._0_8_ = 0x42b0c0a542b0c0a5;
              auVar348._12_4_ = 0x42b0c0a5;
              auVar186 = vminps_avx(auVar348,auVar95);
              auVar355._8_4_ = 0xc2b0c0a5;
              auVar355._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar355._12_4_ = 0xc2b0c0a5;
              auVar99 = vmaxps_avx(auVar355,auVar186);
              auVar361._8_4_ = 0x3fb8aa3b;
              auVar361._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar361._12_4_ = 0x3fb8aa3b;
              auVar244._8_4_ = 0x3f000000;
              auVar244._0_8_ = 0x3f0000003f000000;
              auVar244._12_4_ = 0x3f000000;
              auVar186 = vfmadd213ps_fma(auVar361,auVar99,auVar244);
              auVar212._0_4_ = (int)auVar186._0_4_;
              auVar212._4_4_ = (int)auVar186._4_4_;
              auVar212._8_4_ = (int)auVar186._8_4_;
              auVar212._12_4_ = (int)auVar186._12_4_;
              auVar215 = vcvtdq2ps_avx(auVar212);
              auVar186 = vcmpps_avx(auVar186,auVar215,1);
              auVar186 = vandps_avx(auVar186,auVar131);
              auVar186 = vsubps_avx(auVar215,auVar186);
              auVar349._8_4_ = 0x3f318000;
              auVar349._0_8_ = 0x3f3180003f318000;
              auVar349._12_4_ = 0x3f318000;
              auVar215 = vfmsub231ps_fma(auVar99,auVar186,auVar349);
              auVar267._8_4_ = 0xb95e8083;
              auVar267._0_8_ = 0xb95e8083b95e8083;
              auVar267._12_4_ = 0xb95e8083;
              auVar99 = vfnmsub231ps_fma(auVar215,auVar186,auVar267);
              auVar213._0_4_ = auVar99._0_4_ * auVar99._0_4_;
              auVar213._4_4_ = auVar99._4_4_ * auVar99._4_4_;
              auVar213._8_4_ = auVar99._8_4_ * auVar99._8_4_;
              auVar213._12_4_ = auVar99._12_4_ * auVar99._12_4_;
              auVar373._8_4_ = 0x39506967;
              auVar373._0_8_ = 0x3950696739506967;
              auVar373._12_4_ = 0x39506967;
              auVar366._8_4_ = 0x3ab743ce;
              auVar366._0_8_ = 0x3ab743ce3ab743ce;
              auVar366._12_4_ = 0x3ab743ce;
              auVar215 = vfmadd213ps_fma(auVar373,auVar99,auVar366);
              auVar289._8_4_ = 0x3c088908;
              auVar289._0_8_ = 0x3c0889083c088908;
              auVar289._12_4_ = 0x3c088908;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar289);
              auVar327._8_4_ = 0x3d2aa9c1;
              auVar327._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar327._12_4_ = 0x3d2aa9c1;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar327);
              auVar328._8_4_ = 0x3e2aaaaa;
              auVar328._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar328._12_4_ = 0x3e2aaaaa;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar328);
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar244);
              auVar215 = vfmadd213ps_fma(auVar215,auVar213,auVar99);
              auVar214._0_4_ = auVar215._0_4_ + fVar94;
              auVar214._4_4_ = auVar215._4_4_ + fVar129;
              auVar214._8_4_ = auVar215._8_4_ + fVar307;
              auVar214._12_4_ = auVar215._12_4_ + fVar319;
              auVar133._0_4_ = (int)auVar186._0_4_;
              auVar133._4_4_ = (int)auVar186._4_4_;
              auVar133._8_4_ = (int)auVar186._8_4_;
              auVar133._12_4_ = (int)auVar186._12_4_;
              auVar186 = vpslld_avx(auVar133,0x17);
              auVar186 = vpaddd_avx(auVar186,auVar131);
              auVar291 = vfmadd213ps_fma(auVar186,auVar214,auVar131);
              auVar187._8_4_ = 0x800000;
              auVar187._0_8_ = 0x80000000800000;
              auVar187._12_4_ = 0x800000;
              auVar186 = vmaxps_avx(auVar291,auVar187);
              auVar215 = vpsrld_avx(auVar186,0x17);
              auVar308._8_4_ = 0xffffff82;
              auVar308._0_8_ = 0xffffff82ffffff82;
              auVar308._12_4_ = 0xffffff82;
              auVar215 = vpaddd_avx(auVar308,auVar215);
              auVar309._8_4_ = 0x807fffff;
              auVar309._0_8_ = 0x807fffff807fffff;
              auVar309._12_4_ = 0x807fffff;
              auVar186 = vandps_avx(auVar309,auVar186);
              auVar268 = vorps_avx(auVar186,auVar244);
              auVar99 = vcvtdq2ps_avx(auVar215);
              auVar310._8_4_ = 0x3f3504f3;
              auVar310._0_8_ = 0x3f3504f33f3504f3;
              auVar310._12_4_ = 0x3f3504f3;
              auVar215 = vcmpps_avx(auVar268,auVar310,1);
              auVar186 = vandps_avx(auVar215,auVar268);
              auVar188._0_4_ = auVar186._0_4_ + auVar268._0_4_ + -1.0;
              auVar188._4_4_ = auVar186._4_4_ + auVar268._4_4_ + -1.0;
              auVar188._8_4_ = auVar186._8_4_ + auVar268._8_4_ + -1.0;
              auVar188._12_4_ = auVar186._12_4_ + auVar268._12_4_ + -1.0;
              auVar186 = vandps_avx(auVar215,auVar131);
              auVar215 = vsubps_avx(auVar99,auVar186);
              auVar311._0_4_ = auVar188._0_4_ * auVar188._0_4_;
              auVar311._4_4_ = auVar188._4_4_ * auVar188._4_4_;
              auVar311._8_4_ = auVar188._8_4_ * auVar188._8_4_;
              auVar311._12_4_ = auVar188._12_4_ * auVar188._12_4_;
              auVar329._8_4_ = 0x3d9021bb;
              auVar329._0_8_ = 0x3d9021bb3d9021bb;
              auVar329._12_4_ = 0x3d9021bb;
              auVar336._8_4_ = 0xbdebd1b8;
              auVar336._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar336._12_4_ = 0xbdebd1b8;
              auVar186 = vfmadd213ps_fma(auVar329,auVar188,auVar336);
              auVar337._8_4_ = 0x3def251a;
              auVar337._0_8_ = 0x3def251a3def251a;
              auVar337._12_4_ = 0x3def251a;
              auVar186 = vfmadd213ps_fma(auVar186,auVar188,auVar337);
              auVar338._8_4_ = 0xbdfe5d4f;
              auVar338._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar338._12_4_ = 0xbdfe5d4f;
              auVar186 = vfmadd213ps_fma(auVar186,auVar188,auVar338);
              auVar339._8_4_ = 0x3e11e9bf;
              auVar339._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar339._12_4_ = 0x3e11e9bf;
              auVar186 = vfmadd213ps_fma(auVar186,auVar188,auVar339);
              auVar340._8_4_ = 0xbe2aae50;
              auVar340._0_8_ = 0xbe2aae50be2aae50;
              auVar340._12_4_ = 0xbe2aae50;
              auVar186 = vfmadd213ps_fma(auVar186,auVar188,auVar340);
              auVar341._8_4_ = 0x3e4cceac;
              auVar341._0_8_ = 0x3e4cceac3e4cceac;
              auVar341._12_4_ = 0x3e4cceac;
              auVar186 = vfmadd213ps_fma(auVar186,auVar188,auVar341);
              auVar342._8_4_ = 0xbe7ffffc;
              auVar342._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar342._12_4_ = 0xbe7ffffc;
              auVar186 = vfmadd213ps_fma(auVar186,auVar188,auVar342);
              auVar343._8_4_ = 0x3eaaaaaa;
              auVar343._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar343._12_4_ = 0x3eaaaaaa;
              auVar186 = vfmadd213ps_fma(auVar186,auVar188,auVar343);
              auVar330._0_4_ = auVar311._0_4_ * auVar188._0_4_ * auVar186._0_4_;
              auVar330._4_4_ = auVar311._4_4_ * auVar188._4_4_ * auVar186._4_4_;
              auVar330._8_4_ = auVar311._8_4_ * auVar188._8_4_ * auVar186._8_4_;
              auVar330._12_4_ = auVar311._12_4_ * auVar188._12_4_ * auVar186._12_4_;
              auVar186 = vfmadd231ps_fma(auVar330,auVar215,auVar267);
              auVar99 = vfmsub231ps_fma(auVar186,auVar244,auVar311);
              auVar186 = vcmpps_avx(auVar291,_DAT_00595080,2);
              auVar99 = vsubps_avx(auVar99,auVar188);
              auVar215 = vfnmadd231ps_fma(auVar99,auVar349,auVar215);
              auVar189._0_4_ = auVar215._0_4_ + auVar215._0_4_;
              auVar189._4_4_ = auVar215._4_4_ + auVar215._4_4_;
              auVar189._8_4_ = auVar215._8_4_ + auVar215._8_4_;
              auVar189._12_4_ = auVar215._12_4_ + auVar215._12_4_;
              auVar216._8_4_ = 0x7fffffff;
              auVar216._0_8_ = 0x7fffffff7fffffff;
              auVar216._12_4_ = 0x7fffffff;
              auVar186 = vblendvps_avx(auVar189,auVar216,auVar186);
              auVar190._8_4_ = 0x42b0c0a5;
              auVar190._0_8_ = 0x42b0c0a542b0c0a5;
              auVar190._12_4_ = 0x42b0c0a5;
              auVar186 = vminps_avx(auVar186,auVar190);
              auVar99 = vmaxps_avx(auVar355,auVar186);
              auVar186 = vfmadd213ps_fma(auVar361,auVar99,auVar244);
              auVar217._0_4_ = (int)auVar186._0_4_;
              auVar217._4_4_ = (int)auVar186._4_4_;
              auVar217._8_4_ = (int)auVar186._8_4_;
              auVar217._12_4_ = (int)auVar186._12_4_;
              auVar215 = vcvtdq2ps_avx(auVar217);
              auVar186 = vcmpps_avx(auVar186,auVar215,1);
              auVar186 = vandps_avx(auVar186,auVar131);
              auVar186 = vsubps_avx(auVar215,auVar186);
              auVar215 = vfmsub231ps_fma(auVar99,auVar186,auVar349);
              auVar99 = vfnmsub231ps_fma(auVar215,auVar186,auVar267);
              auVar288 = ZEXT1664(auVar131);
              auVar218._0_4_ = auVar99._0_4_ * auVar99._0_4_;
              auVar218._4_4_ = auVar99._4_4_ * auVar99._4_4_;
              auVar218._8_4_ = auVar99._8_4_ * auVar99._8_4_;
              auVar218._12_4_ = auVar99._12_4_ * auVar99._12_4_;
              auVar215 = vfmadd213ps_fma(auVar373,auVar99,auVar366);
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar289);
              auVar61._8_4_ = 0x3d2aa9c1;
              auVar61._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar61._12_4_ = 0x3d2aa9c1;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar61);
              auVar62._8_4_ = 0x3e2aaaaa;
              auVar62._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar62._12_4_ = 0x3e2aaaaa;
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar62);
              auVar215 = vfmadd213ps_fma(auVar215,auVar99,auVar244);
              auVar215 = vfmadd213ps_fma(auVar215,auVar218,auVar99);
              auVar134._0_4_ = auVar215._0_4_ + fVar94;
              auVar134._4_4_ = auVar215._4_4_ + fVar129;
              auVar134._8_4_ = auVar215._8_4_ + fVar307;
              auVar134._12_4_ = auVar215._12_4_ + fVar319;
              auVar191._0_4_ = (int)auVar186._0_4_;
              auVar191._4_4_ = (int)auVar186._4_4_;
              auVar191._8_4_ = (int)auVar186._8_4_;
              auVar191._12_4_ = (int)auVar186._12_4_;
              auVar186 = vpslld_avx(auVar191,0x17);
              auVar186 = vpaddd_avx(auVar186,auVar131);
              auVar186 = vfmadd213ps_fma(auVar186,auVar134,auVar131);
              auVar131 = vrcpps_avx(auVar186);
              auVar219._0_4_ = auVar131._0_4_ + auVar131._0_4_;
              auVar219._4_4_ = auVar131._4_4_ + auVar131._4_4_;
              auVar219._8_4_ = auVar131._8_4_ + auVar131._8_4_;
              auVar219._12_4_ = auVar131._12_4_ + auVar131._12_4_;
              auVar63._8_4_ = 0x40000000;
              auVar63._0_8_ = 0x4000000040000000;
              auVar63._12_4_ = 0x40000000;
              auVar186 = vfmsub213ps_fma(auVar186,auVar219,auVar63);
              auVar131 = vfnmadd213ps_fma(auVar186,auVar131,auVar219);
              auVar95 = vfmsub231ps_fma(auVar95,auVar95,auVar131);
              break;
            case 6:
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar139._4_4_ = uVar2;
              auVar139._0_4_ = uVar2;
              auVar139._8_4_ = uVar2;
              auVar139._12_4_ = uVar2;
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar197._4_4_ = uVar2;
              auVar197._0_4_ = uVar2;
              auVar197._8_4_ = uVar2;
              auVar197._12_4_ = uVar2;
              auVar186 = vfmadd231ps_fma(auVar197,auVar95,auVar139);
              auVar186 = vmaxps_avx(auVar186,_DAT_00595080);
              auVar131 = vminps_avx(auVar186,auVar131);
              auVar95._0_4_ = auVar131._0_4_ * auVar95._0_4_;
              auVar95._4_4_ = auVar131._4_4_ * auVar95._4_4_;
              auVar95._8_4_ = auVar131._8_4_ * auVar95._8_4_;
              auVar95._12_4_ = auVar131._12_4_ * auVar95._12_4_;
            }
            *(undefined1 (*) [16])((long)top_blob->data + uVar34 * 0x10) = auVar95;
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar32);
        }
        iVar43 = 0;
      }
      else if (iVar31 == 8) {
        if (0 < (int)uVar32) {
          uVar34 = 0;
          auVar288 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          do {
            auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
            if (lVar21 != 0) {
              auVar128 = ZEXT3264(*(undefined1 (*) [32])(lVar21 + uVar34 * 0x20));
            }
            pauVar40 = (undefined1 (*) [32])
                       ((long)(this->weight_data_tm).w * uVar34 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
            pauVar36 = local_3b8;
            if ((int)uVar53 < 8) {
              auVar90 = SUB6432(ZEXT864(0),0);
              auVar88 = SUB6432(ZEXT864(0),0);
              auVar272 = SUB6432(ZEXT864(0),0);
              auVar77 = SUB6432(ZEXT864(0),0);
              auVar184 = ZEXT864(0);
              auVar211 = ZEXT864(0);
              auVar379 = ZEXT864(0);
              uVar30 = 0;
            }
            else {
              auVar379 = ZEXT864(0);
              iVar43 = 7;
              auVar211 = ZEXT864(0);
              auVar184 = ZEXT864(0);
              auVar354 = ZEXT864(0);
              auVar266 = ZEXT864(0);
              auVar360 = ZEXT864(0);
              auVar335 = ZEXT864(0);
              do {
                uVar2 = *(undefined4 *)*pauVar36;
                auVar362._4_4_ = uVar2;
                auVar362._0_4_ = uVar2;
                auVar362._8_4_ = uVar2;
                auVar362._12_4_ = uVar2;
                auVar362._16_4_ = uVar2;
                auVar362._20_4_ = uVar2;
                auVar362._24_4_ = uVar2;
                auVar362._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 4);
                auVar370._4_4_ = uVar2;
                auVar370._0_4_ = uVar2;
                auVar370._8_4_ = uVar2;
                auVar370._12_4_ = uVar2;
                auVar370._16_4_ = uVar2;
                auVar370._20_4_ = uVar2;
                auVar370._24_4_ = uVar2;
                auVar370._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 8);
                auVar345._4_4_ = uVar2;
                auVar345._0_4_ = uVar2;
                auVar345._8_4_ = uVar2;
                auVar345._12_4_ = uVar2;
                auVar345._16_4_ = uVar2;
                auVar345._20_4_ = uVar2;
                auVar345._24_4_ = uVar2;
                auVar345._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0xc);
                auVar293._4_4_ = uVar2;
                auVar293._0_4_ = uVar2;
                auVar293._8_4_ = uVar2;
                auVar293._12_4_ = uVar2;
                auVar293._16_4_ = uVar2;
                auVar293._20_4_ = uVar2;
                auVar293._24_4_ = uVar2;
                auVar293._28_4_ = uVar2;
                auVar272 = vlddqu_avx(*pauVar40);
                auVar90 = vlddqu_avx(pauVar40[1]);
                auVar77 = vcvtph2ps_f16c(auVar272._0_16_);
                auVar131 = vfmadd231ps_fma(auVar128._0_32_,auVar362,auVar77);
                auVar128 = ZEXT1664(auVar131);
                auVar272 = vcvtph2ps_f16c(auVar272._16_16_);
                auVar131 = vfmadd231ps_fma(auVar379._0_32_,auVar370,auVar272);
                auVar379 = ZEXT1664(auVar131);
                auVar272 = vcvtph2ps_f16c(auVar90._0_16_);
                auVar131 = vfmadd231ps_fma(auVar211._0_32_,auVar345,auVar272);
                auVar211 = ZEXT1664(auVar131);
                auVar272 = vcvtph2ps_f16c(auVar90._16_16_);
                auVar131 = vfmadd231ps_fma(auVar184._0_32_,auVar293,auVar272);
                auVar184 = ZEXT1664(auVar131);
                uVar2 = *(undefined4 *)(*pauVar36 + 0x10);
                auVar74._4_4_ = uVar2;
                auVar74._0_4_ = uVar2;
                auVar74._8_4_ = uVar2;
                auVar74._12_4_ = uVar2;
                auVar74._16_4_ = uVar2;
                auVar74._20_4_ = uVar2;
                auVar74._24_4_ = uVar2;
                auVar74._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0x14);
                auVar235._4_4_ = uVar2;
                auVar235._0_4_ = uVar2;
                auVar235._8_4_ = uVar2;
                auVar235._12_4_ = uVar2;
                auVar235._16_4_ = uVar2;
                auVar235._20_4_ = uVar2;
                auVar235._24_4_ = uVar2;
                auVar235._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0x18);
                auVar294._4_4_ = uVar2;
                auVar294._0_4_ = uVar2;
                auVar294._8_4_ = uVar2;
                auVar294._12_4_ = uVar2;
                auVar294._16_4_ = uVar2;
                auVar294._20_4_ = uVar2;
                auVar294._24_4_ = uVar2;
                auVar294._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(*pauVar36 + 0x1c);
                auVar314._4_4_ = uVar2;
                auVar314._0_4_ = uVar2;
                auVar314._8_4_ = uVar2;
                auVar314._12_4_ = uVar2;
                auVar314._16_4_ = uVar2;
                auVar314._20_4_ = uVar2;
                auVar314._24_4_ = uVar2;
                auVar314._28_4_ = uVar2;
                auVar272 = vlddqu_avx(pauVar40[2]);
                auVar90 = vlddqu_avx(pauVar40[3]);
                auVar77 = vcvtph2ps_f16c(auVar272._0_16_);
                auVar131 = vfmadd231ps_fma(auVar354._0_32_,auVar74,auVar77);
                auVar354 = ZEXT1664(auVar131);
                auVar77 = ZEXT1632(auVar131);
                auVar272 = vcvtph2ps_f16c(auVar272._16_16_);
                auVar131 = vfmadd231ps_fma(auVar266._0_32_,auVar235,auVar272);
                auVar266 = ZEXT1664(auVar131);
                auVar272 = ZEXT1632(auVar131);
                auVar88 = vcvtph2ps_f16c(auVar90._0_16_);
                auVar131 = vfmadd231ps_fma(auVar360._0_32_,auVar294,auVar88);
                auVar360 = ZEXT1664(auVar131);
                auVar88 = ZEXT1632(auVar131);
                auVar90 = vcvtph2ps_f16c(auVar90._16_16_);
                auVar131 = vfmadd231ps_fma(auVar335._0_32_,auVar314,auVar90);
                auVar335 = ZEXT1664(auVar131);
                auVar90 = ZEXT1632(auVar131);
                pauVar36 = pauVar36 + 1;
                pauVar40 = pauVar40 + 4;
                iVar43 = iVar43 + 8;
                uVar30 = uVar53 & 0xfffffff8;
              } while (iVar43 < (int)uVar53);
            }
            auVar183 = auVar379._0_32_;
            auVar182 = auVar211._0_32_;
            auVar127 = auVar184._0_32_;
            uVar48 = uVar30 | 3;
            while (auVar111 = auVar128._0_32_, (int)uVar48 < (int)uVar53) {
              uVar2 = *(undefined4 *)*pauVar36;
              auVar75._4_4_ = uVar2;
              auVar75._0_4_ = uVar2;
              auVar75._8_4_ = uVar2;
              auVar75._12_4_ = uVar2;
              auVar75._16_4_ = uVar2;
              auVar75._20_4_ = uVar2;
              auVar75._24_4_ = uVar2;
              auVar75._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar36 + 4);
              auVar236._4_4_ = uVar2;
              auVar236._0_4_ = uVar2;
              auVar236._8_4_ = uVar2;
              auVar236._12_4_ = uVar2;
              auVar236._16_4_ = uVar2;
              auVar236._20_4_ = uVar2;
              auVar236._24_4_ = uVar2;
              auVar236._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar36 + 8);
              auVar295._4_4_ = uVar2;
              auVar295._0_4_ = uVar2;
              auVar295._8_4_ = uVar2;
              auVar295._12_4_ = uVar2;
              auVar295._16_4_ = uVar2;
              auVar295._20_4_ = uVar2;
              auVar295._24_4_ = uVar2;
              auVar295._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(*pauVar36 + 0xc);
              auVar315._4_4_ = uVar2;
              auVar315._0_4_ = uVar2;
              auVar315._8_4_ = uVar2;
              auVar315._12_4_ = uVar2;
              auVar315._16_4_ = uVar2;
              auVar315._20_4_ = uVar2;
              auVar315._24_4_ = uVar2;
              auVar315._28_4_ = uVar2;
              auVar127 = vlddqu_avx(*pauVar40);
              auVar24 = vlddqu_avx(pauVar40[1]);
              auVar182 = vcvtph2ps_f16c(auVar127._0_16_);
              auVar131 = vfmadd231ps_fma(auVar111,auVar75,auVar182);
              auVar128 = ZEXT1664(auVar131);
              auVar127 = vcvtph2ps_f16c(auVar127._16_16_);
              auVar131 = vfmadd231ps_fma(auVar379._0_32_,auVar236,auVar127);
              auVar379 = ZEXT1664(auVar131);
              auVar183 = ZEXT1632(auVar131);
              auVar127 = vcvtph2ps_f16c(auVar24._0_16_);
              auVar131 = vfmadd231ps_fma(auVar211._0_32_,auVar295,auVar127);
              auVar211 = ZEXT1664(auVar131);
              auVar182 = ZEXT1632(auVar131);
              auVar127 = vcvtph2ps_f16c(auVar24._16_16_);
              auVar131 = vfmadd231ps_fma(auVar184._0_32_,auVar315,auVar127);
              auVar184 = ZEXT1664(auVar131);
              auVar127 = ZEXT1632(auVar131);
              pauVar36 = (undefined1 (*) [32])(*pauVar36 + 0x10);
              pauVar40 = pauVar40 + 2;
              uVar48 = uVar30 + 7;
              uVar30 = uVar30 + 4;
            }
            if (uVar53 - uVar30 != 0 && (int)uVar30 <= (int)uVar53) {
              lVar44 = 0;
              do {
                uVar2 = *(undefined4 *)(*pauVar36 + lVar44 * 4);
                auVar76._4_4_ = uVar2;
                auVar76._0_4_ = uVar2;
                auVar76._8_4_ = uVar2;
                auVar76._12_4_ = uVar2;
                auVar76._16_4_ = uVar2;
                auVar76._20_4_ = uVar2;
                auVar76._24_4_ = uVar2;
                auVar76._28_4_ = uVar2;
                auVar131 = vlddqu_avx(*(undefined1 (*) [16])*pauVar40);
                auVar111 = vcvtph2ps_f16c(auVar131);
                auVar131 = vfmadd231ps_fma(auVar128._0_32_,auVar76,auVar111);
                auVar128 = ZEXT1664(auVar131);
                auVar111 = ZEXT1632(auVar131);
                pauVar40 = (undefined1 (*) [32])(*pauVar40 + 0x10);
                lVar44 = lVar44 + 1;
              } while (uVar53 - uVar30 != (int)lVar44);
            }
            fVar94 = auVar88._0_4_ + auVar90._0_4_ + auVar77._0_4_ + auVar272._0_4_ +
                     auVar183._0_4_ + auVar127._0_4_ + auVar182._0_4_ + auVar111._0_4_;
            fVar129 = auVar88._4_4_ + auVar90._4_4_ + auVar77._4_4_ + auVar272._4_4_ +
                      auVar183._4_4_ + auVar127._4_4_ + auVar182._4_4_ + auVar111._4_4_;
            auVar112._0_8_ = CONCAT44(fVar129,fVar94);
            auVar112._8_4_ =
                 auVar88._8_4_ + auVar90._8_4_ + auVar77._8_4_ + auVar272._8_4_ +
                 auVar183._8_4_ + auVar127._8_4_ + auVar182._8_4_ + auVar111._8_4_;
            auVar112._12_4_ =
                 auVar88._12_4_ + auVar90._12_4_ + auVar77._12_4_ + auVar272._12_4_ +
                 auVar183._12_4_ + auVar127._12_4_ + auVar182._12_4_ + auVar111._12_4_;
            auVar112._16_4_ =
                 auVar88._16_4_ + auVar90._16_4_ + auVar77._16_4_ + auVar272._16_4_ +
                 auVar183._16_4_ + auVar127._16_4_ + auVar182._16_4_ + auVar111._16_4_;
            auVar112._20_4_ =
                 auVar88._20_4_ + auVar90._20_4_ + auVar77._20_4_ + auVar272._20_4_ +
                 auVar183._20_4_ + auVar127._20_4_ + auVar182._20_4_ + auVar111._20_4_;
            auVar112._24_4_ =
                 auVar88._24_4_ + auVar90._24_4_ + auVar77._24_4_ + auVar272._24_4_ +
                 auVar183._24_4_ + auVar127._24_4_ + auVar182._24_4_ + auVar111._24_4_;
            auVar112._28_4_ =
                 auVar88._28_4_ + auVar90._28_4_ + auVar77._28_4_ + auVar272._28_4_ +
                 auVar183._28_4_ + auVar127._28_4_ + auVar182._28_4_ + auVar111._28_4_;
            auVar272 = auVar288._0_32_;
            fVar307 = auVar288._0_4_;
            fVar319 = auVar288._4_4_;
            fVar185 = auVar288._8_4_;
            fVar320 = auVar288._12_4_;
            fVar321 = auVar288._16_4_;
            fVar322 = auVar288._20_4_;
            fVar323 = auVar288._24_4_;
            fVar324 = auVar288._28_4_;
            switch(uVar18) {
            case 1:
              auVar112 = vmaxps_avx(auVar112,_DAT_0059a1e0);
              break;
            case 2:
              auVar272 = vmaxps_avx(auVar112,ZEXT432(0) << 0x20);
              auVar90 = vminps_avx(auVar112,ZEXT432(0) << 0x20);
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar117._4_4_ = uVar2;
              auVar117._0_4_ = uVar2;
              auVar117._8_4_ = uVar2;
              auVar117._12_4_ = uVar2;
              auVar117._16_4_ = uVar2;
              auVar117._20_4_ = uVar2;
              auVar117._24_4_ = uVar2;
              auVar117._28_4_ = uVar2;
              auVar131 = vfmadd213ps_fma(auVar117,auVar90,auVar272);
              auVar112 = ZEXT1632(auVar131);
              break;
            case 3:
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar83._4_4_ = uVar2;
              auVar83._0_4_ = uVar2;
              auVar83._8_4_ = uVar2;
              auVar83._12_4_ = uVar2;
              auVar83._16_4_ = uVar2;
              auVar83._20_4_ = uVar2;
              auVar83._24_4_ = uVar2;
              auVar83._28_4_ = uVar2;
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar167._4_4_ = uVar2;
              auVar167._0_4_ = uVar2;
              auVar167._8_4_ = uVar2;
              auVar167._12_4_ = uVar2;
              auVar167._16_4_ = uVar2;
              auVar167._20_4_ = uVar2;
              auVar167._24_4_ = uVar2;
              auVar167._28_4_ = uVar2;
              auVar272 = vmaxps_avx(auVar112,auVar83);
              auVar112 = vminps_avx(auVar272,auVar167);
              break;
            case 4:
              auVar84._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
              auVar84._8_4_ = -auVar112._8_4_;
              auVar84._12_4_ = -auVar112._12_4_;
              auVar84._16_4_ = -auVar112._16_4_;
              auVar84._20_4_ = -auVar112._20_4_;
              auVar84._24_4_ = -auVar112._24_4_;
              auVar84._28_4_ = -auVar112._28_4_;
              auVar113._8_4_ = 0x42b0c0a5;
              auVar113._0_8_ = 0x42b0c0a542b0c0a5;
              auVar113._12_4_ = 0x42b0c0a5;
              auVar113._16_4_ = 0x42b0c0a5;
              auVar113._20_4_ = 0x42b0c0a5;
              auVar113._24_4_ = 0x42b0c0a5;
              auVar113._28_4_ = 0x42b0c0a5;
              auVar90 = vminps_avx(auVar84,auVar113);
              auVar114._8_4_ = 0xc2b0c0a5;
              auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar114._12_4_ = 0xc2b0c0a5;
              auVar114._16_4_ = 0xc2b0c0a5;
              auVar114._20_4_ = 0xc2b0c0a5;
              auVar114._24_4_ = 0xc2b0c0a5;
              auVar114._28_4_ = 0xc2b0c0a5;
              auVar77 = vmaxps_avx(auVar90,auVar114);
              auVar115._8_4_ = 0x3fb8aa3b;
              auVar115._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar115._12_4_ = 0x3fb8aa3b;
              auVar115._16_4_ = 0x3fb8aa3b;
              auVar115._20_4_ = 0x3fb8aa3b;
              auVar115._24_4_ = 0x3fb8aa3b;
              auVar115._28_4_ = 0x3fb8aa3b;
              auVar238._8_4_ = 0x3f000000;
              auVar238._0_8_ = 0x3f0000003f000000;
              auVar238._12_4_ = 0x3f000000;
              auVar238._16_4_ = 0x3f000000;
              auVar238._20_4_ = 0x3f000000;
              auVar238._24_4_ = 0x3f000000;
              auVar238._28_4_ = 0x3f000000;
              auVar131 = vfmadd213ps_fma(auVar115,auVar77,auVar238);
              auVar88 = vroundps_avx(ZEXT1632(auVar131),1);
              auVar90 = vcmpps_avx(ZEXT1632(auVar131),auVar88,1);
              auVar90 = vandps_avx(auVar90,auVar272);
              auVar90 = vsubps_avx(auVar88,auVar90);
              auVar168._8_4_ = 0x3f318000;
              auVar168._0_8_ = 0x3f3180003f318000;
              auVar168._12_4_ = 0x3f318000;
              auVar168._16_4_ = 0x3f318000;
              auVar168._20_4_ = 0x3f318000;
              auVar168._24_4_ = 0x3f318000;
              auVar168._28_4_ = 0x3f318000;
              auVar131 = vfmsub231ps_fma(auVar77,auVar90,auVar168);
              auVar169._8_4_ = 0x395e8083;
              auVar169._0_8_ = 0x395e8083395e8083;
              auVar169._12_4_ = 0x395e8083;
              auVar169._16_4_ = 0x395e8083;
              auVar169._20_4_ = 0x395e8083;
              auVar169._24_4_ = 0x395e8083;
              auVar169._28_4_ = 0x395e8083;
              auVar186 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar90,auVar169);
              auVar77 = ZEXT1632(auVar186);
              auVar28._28_4_ = 0x395e8083;
              auVar28._0_28_ =
                   ZEXT1628(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                      CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                               CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                        auVar186._0_4_ * auVar186._0_4_))));
              auVar206._8_4_ = 0x39506967;
              auVar206._0_8_ = 0x3950696739506967;
              auVar206._12_4_ = 0x39506967;
              auVar206._16_4_ = 0x39506967;
              auVar206._20_4_ = 0x39506967;
              auVar206._24_4_ = 0x39506967;
              auVar206._28_4_ = 0x39506967;
              auVar254._8_4_ = 0x3ab743ce;
              auVar254._0_8_ = 0x3ab743ce3ab743ce;
              auVar254._12_4_ = 0x3ab743ce;
              auVar254._16_4_ = 0x3ab743ce;
              auVar254._20_4_ = 0x3ab743ce;
              auVar254._24_4_ = 0x3ab743ce;
              auVar254._28_4_ = 0x3ab743ce;
              auVar131 = vfmadd213ps_fma(auVar206,auVar77,auVar254);
              auVar255._8_4_ = 0x3c088908;
              auVar255._0_8_ = 0x3c0889083c088908;
              auVar255._12_4_ = 0x3c088908;
              auVar255._16_4_ = 0x3c088908;
              auVar255._20_4_ = 0x3c088908;
              auVar255._24_4_ = 0x3c088908;
              auVar255._28_4_ = 0x3c088908;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar255);
              auVar256._8_4_ = 0x3d2aa9c1;
              auVar256._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar256._12_4_ = 0x3d2aa9c1;
              auVar256._16_4_ = 0x3d2aa9c1;
              auVar256._20_4_ = 0x3d2aa9c1;
              auVar256._24_4_ = 0x3d2aa9c1;
              auVar256._28_4_ = 0x3d2aa9c1;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar256);
              auVar257._8_4_ = 0x3e2aaaaa;
              auVar257._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar257._12_4_ = 0x3e2aaaaa;
              auVar257._16_4_ = 0x3e2aaaaa;
              auVar257._20_4_ = 0x3e2aaaaa;
              auVar257._24_4_ = 0x3e2aaaaa;
              auVar257._28_4_ = 0x3e2aaaaa;
              auVar77 = ZEXT1632(auVar186);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar257);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar238);
              auVar215 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar28,auVar77);
              auVar60._0_4_ = (int)auVar90._0_4_;
              auVar60._4_4_ = (int)auVar90._4_4_;
              auVar60._8_4_ = (int)auVar90._8_4_;
              auVar60._12_4_ = (int)auVar90._12_4_;
              auVar85._16_4_ = (int)auVar90._16_4_;
              auVar85._0_16_ = auVar60;
              auVar85._20_4_ = (int)auVar90._20_4_;
              auVar85._24_4_ = (int)auVar90._24_4_;
              auVar85._28_4_ = (int)auVar90._28_4_;
              auVar186 = vpslld_avx(auVar60,0x17);
              auVar131 = vpslld_avx(auVar85._16_16_,0x17);
              auVar132._8_4_ = 0x3f800000;
              auVar132._0_8_ = 0x3f8000003f800000;
              auVar132._12_4_ = 0x3f800000;
              auVar131 = vpaddd_avx(auVar131,auVar132);
              auVar186 = vpaddd_avx(auVar186,auVar132);
              auVar116._16_16_ = auVar131;
              auVar116._0_16_ = auVar186;
              auVar86._0_4_ = auVar215._0_4_ + fVar307;
              auVar86._4_4_ = auVar215._4_4_ + fVar319;
              auVar86._8_4_ = auVar215._8_4_ + fVar185;
              auVar86._12_4_ = auVar215._12_4_ + fVar320;
              auVar86._16_4_ = fVar321 + 0.0;
              auVar86._20_4_ = fVar322 + 0.0;
              auVar86._24_4_ = fVar323 + 0.0;
              auVar86._28_4_ = fVar324 + 0.0;
              auVar131 = vfmadd213ps_fma(auVar116,auVar86,auVar272);
              auVar90 = vrcpps_avx(ZEXT1632(auVar131));
              auVar131 = vfmsub213ps_fma(ZEXT1632(auVar131),auVar90,auVar272);
              auVar131 = vfnmadd132ps_fma(ZEXT1632(auVar131),auVar90,auVar90);
              auVar112 = ZEXT1632(auVar131);
              break;
            case 5:
              auVar316._8_4_ = 0x42b0c0a5;
              auVar316._0_8_ = 0x42b0c0a542b0c0a5;
              auVar316._12_4_ = 0x42b0c0a5;
              auVar316._16_4_ = 0x42b0c0a5;
              auVar316._20_4_ = 0x42b0c0a5;
              auVar316._24_4_ = 0x42b0c0a5;
              auVar316._28_4_ = 0x42b0c0a5;
              auVar90 = vminps_avx(auVar316,auVar112);
              auVar331._8_4_ = 0xc2b0c0a5;
              auVar331._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar331._12_4_ = 0xc2b0c0a5;
              auVar331._16_4_ = 0xc2b0c0a5;
              auVar331._20_4_ = 0xc2b0c0a5;
              auVar331._24_4_ = 0xc2b0c0a5;
              auVar331._28_4_ = 0xc2b0c0a5;
              auVar77 = vmaxps_avx(auVar331,auVar90);
              auVar160._8_4_ = 0x3fb8aa3b;
              auVar160._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar160._12_4_ = 0x3fb8aa3b;
              auVar160._16_4_ = 0x3fb8aa3b;
              auVar160._20_4_ = 0x3fb8aa3b;
              auVar160._24_4_ = 0x3fb8aa3b;
              auVar160._28_4_ = 0x3fb8aa3b;
              auVar346._8_4_ = 0x3f000000;
              auVar346._0_8_ = 0x3f0000003f000000;
              auVar346._12_4_ = 0x3f000000;
              auVar346._16_4_ = 0x3f000000;
              auVar346._20_4_ = 0x3f000000;
              auVar346._24_4_ = 0x3f000000;
              auVar346._28_4_ = 0x3f000000;
              auVar131 = vfmadd213ps_fma(auVar160,auVar77,auVar346);
              auVar88 = vroundps_avx(ZEXT1632(auVar131),1);
              auVar90 = vcmpps_avx(ZEXT1632(auVar131),auVar88,1);
              auVar90 = vandps_avx(auVar90,auVar272);
              auVar90 = vsubps_avx(auVar88,auVar90);
              auVar357._8_4_ = 0x3f318000;
              auVar357._0_8_ = 0x3f3180003f318000;
              auVar357._12_4_ = 0x3f318000;
              auVar357._16_4_ = 0x3f318000;
              auVar357._20_4_ = 0x3f318000;
              auVar357._24_4_ = 0x3f318000;
              auVar357._28_4_ = 0x3f318000;
              auVar131 = vfmsub231ps_fma(auVar77,auVar90,auVar357);
              auVar351._8_4_ = 0xb95e8083;
              auVar351._0_8_ = 0xb95e8083b95e8083;
              auVar351._12_4_ = 0xb95e8083;
              auVar351._16_4_ = 0xb95e8083;
              auVar351._20_4_ = 0xb95e8083;
              auVar351._24_4_ = 0xb95e8083;
              auVar351._28_4_ = 0xb95e8083;
              auVar186 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar90,auVar351);
              auVar77 = ZEXT1632(auVar186);
              auVar25._28_4_ = auVar88._28_4_;
              auVar25._0_28_ =
                   ZEXT1628(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                      CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                               CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                        auVar186._0_4_ * auVar186._0_4_))));
              auVar371._8_4_ = 0x39506967;
              auVar371._0_8_ = 0x3950696739506967;
              auVar371._12_4_ = 0x39506967;
              auVar371._16_4_ = 0x39506967;
              auVar371._20_4_ = 0x39506967;
              auVar371._24_4_ = 0x39506967;
              auVar371._28_4_ = 0x39506967;
              auVar363._8_4_ = 0x3ab743ce;
              auVar363._0_8_ = 0x3ab743ce3ab743ce;
              auVar363._12_4_ = 0x3ab743ce;
              auVar363._16_4_ = 0x3ab743ce;
              auVar363._20_4_ = 0x3ab743ce;
              auVar363._24_4_ = 0x3ab743ce;
              auVar363._28_4_ = 0x3ab743ce;
              auVar131 = vfmadd213ps_fma(auVar371,auVar77,auVar363);
              auVar377._8_4_ = 0x3c088908;
              auVar377._0_8_ = 0x3c0889083c088908;
              auVar377._12_4_ = 0x3c088908;
              auVar377._16_4_ = 0x3c088908;
              auVar377._20_4_ = 0x3c088908;
              auVar377._24_4_ = 0x3c088908;
              auVar377._28_4_ = 0x3c088908;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar377);
              auVar273._8_4_ = 0x3d2aa9c1;
              auVar273._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar273._12_4_ = 0x3d2aa9c1;
              auVar273._16_4_ = 0x3d2aa9c1;
              auVar273._20_4_ = 0x3d2aa9c1;
              auVar273._24_4_ = 0x3d2aa9c1;
              auVar273._28_4_ = 0x3d2aa9c1;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar273);
              auVar250._8_4_ = 0x3e2aaaaa;
              auVar250._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar250._12_4_ = 0x3e2aaaaa;
              auVar250._16_4_ = 0x3e2aaaaa;
              auVar250._20_4_ = 0x3e2aaaaa;
              auVar250._24_4_ = 0x3e2aaaaa;
              auVar250._28_4_ = 0x3e2aaaaa;
              auVar77 = ZEXT1632(auVar186);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar250);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar346);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar25,auVar77);
              auVar78._0_4_ = fVar307 + auVar131._0_4_;
              auVar78._4_4_ = fVar319 + auVar131._4_4_;
              auVar78._8_4_ = fVar185 + auVar131._8_4_;
              auVar78._12_4_ = fVar320 + auVar131._12_4_;
              auVar78._16_4_ = fVar321 + 0.0;
              auVar78._20_4_ = fVar322 + 0.0;
              auVar78._24_4_ = fVar323 + 0.0;
              auVar78._28_4_ = fVar324 + 0.0;
              auVar130._0_4_ = (int)auVar90._0_4_;
              auVar130._4_4_ = (int)auVar90._4_4_;
              auVar130._8_4_ = (int)auVar90._8_4_;
              auVar130._12_4_ = (int)auVar90._12_4_;
              auVar161._16_4_ = (int)auVar90._16_4_;
              auVar161._0_16_ = auVar130;
              auVar161._20_4_ = (int)auVar90._20_4_;
              auVar161._24_4_ = (int)auVar90._24_4_;
              auVar161._28_4_ = (int)auVar90._28_4_;
              auVar186 = vpslld_avx(auVar130,0x17);
              auVar131 = vpslld_avx(auVar161._16_16_,0x17);
              auVar325._8_4_ = 0x3f800000;
              auVar325._0_8_ = 0x3f8000003f800000;
              auVar325._12_4_ = 0x3f800000;
              auVar131 = vpaddd_avx(auVar325,auVar131);
              auVar186 = vpaddd_avx(auVar325,auVar186);
              auVar162._16_16_ = auVar131;
              auVar162._0_16_ = auVar186;
              auVar215 = vfmadd213ps_fma(auVar162,auVar78,auVar272);
              auVar79._8_4_ = 0x800000;
              auVar79._0_8_ = 0x80000000800000;
              auVar79._12_4_ = 0x800000;
              auVar79._16_4_ = 0x800000;
              auVar79._20_4_ = 0x800000;
              auVar79._24_4_ = 0x800000;
              auVar79._28_4_ = 0x800000;
              auVar90 = vmaxps_avx(ZEXT1632(auVar215),auVar79);
              auVar186 = vpsrld_avx(auVar90._0_16_,0x17);
              auVar131 = vpsrld_avx(auVar90._16_16_,0x17);
              auVar202._8_4_ = 0x807fffff;
              auVar202._0_8_ = 0x807fffff807fffff;
              auVar202._12_4_ = 0x807fffff;
              auVar202._16_4_ = 0x807fffff;
              auVar202._20_4_ = 0x807fffff;
              auVar202._24_4_ = 0x807fffff;
              auVar202._28_4_ = 0x807fffff;
              auVar90 = vandps_avx(auVar90,auVar202);
              auVar88 = vorps_avx(auVar346,auVar90);
              auVar203._8_4_ = 0x3f3504f3;
              auVar203._0_8_ = 0x3f3504f33f3504f3;
              auVar203._12_4_ = 0x3f3504f3;
              auVar203._16_4_ = 0x3f3504f3;
              auVar203._20_4_ = 0x3f3504f3;
              auVar203._24_4_ = 0x3f3504f3;
              auVar203._28_4_ = 0x3f3504f3;
              auVar77 = vcmpps_avx(auVar203,auVar88,2);
              auVar90 = vandnps_avx(auVar77,auVar88);
              auVar364._8_4_ = 0xbf800000;
              auVar364._0_8_ = 0xbf800000bf800000;
              auVar364._12_4_ = 0xbf800000;
              auVar364._16_4_ = 0xbf800000;
              auVar364._20_4_ = 0xbf800000;
              auVar364._24_4_ = 0xbf800000;
              auVar364._28_4_ = 0xbf800000;
              auVar204._0_4_ = auVar88._0_4_ + -1.0 + auVar90._0_4_;
              auVar204._4_4_ = auVar88._4_4_ + -1.0 + auVar90._4_4_;
              auVar204._8_4_ = auVar88._8_4_ + -1.0 + auVar90._8_4_;
              auVar204._12_4_ = auVar88._12_4_ + -1.0 + auVar90._12_4_;
              auVar204._16_4_ = auVar88._16_4_ + -1.0 + auVar90._16_4_;
              auVar204._20_4_ = auVar88._20_4_ + -1.0 + auVar90._20_4_;
              auVar204._24_4_ = auVar88._24_4_ + -1.0 + auVar90._24_4_;
              auVar204._28_4_ = auVar88._28_4_ + -1.0 + auVar90._28_4_;
              auVar131 = vpsubd_avx(auVar131,auVar77._16_16_);
              auVar243._8_4_ = 0xffffff81;
              auVar243._0_8_ = 0xffffff81ffffff81;
              auVar243._12_4_ = 0xffffff81;
              auVar131 = vpaddd_avx(auVar131,auVar243);
              auVar186 = vpsubd_avx(auVar186,auVar77._0_16_);
              auVar186 = vpaddd_avx(auVar186,auVar243);
              auVar80._16_16_ = auVar131;
              auVar80._0_16_ = auVar186;
              auVar237._0_4_ = auVar204._0_4_ * auVar204._0_4_;
              auVar237._4_4_ = auVar204._4_4_ * auVar204._4_4_;
              auVar237._8_4_ = auVar204._8_4_ * auVar204._8_4_;
              auVar237._12_4_ = auVar204._12_4_ * auVar204._12_4_;
              auVar237._16_4_ = auVar204._16_4_ * auVar204._16_4_;
              auVar237._20_4_ = auVar204._20_4_ * auVar204._20_4_;
              auVar237._24_4_ = auVar204._24_4_ * auVar204._24_4_;
              auVar237._28_4_ = 0;
              auVar251._8_4_ = 0x3d9021bb;
              auVar251._0_8_ = 0x3d9021bb3d9021bb;
              auVar251._12_4_ = 0x3d9021bb;
              auVar251._16_4_ = 0x3d9021bb;
              auVar251._20_4_ = 0x3d9021bb;
              auVar251._24_4_ = 0x3d9021bb;
              auVar251._28_4_ = 0x3d9021bb;
              auVar296._8_4_ = 0xbdebd1b8;
              auVar296._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar296._12_4_ = 0xbdebd1b8;
              auVar296._16_4_ = 0xbdebd1b8;
              auVar296._20_4_ = 0xbdebd1b8;
              auVar296._24_4_ = 0xbdebd1b8;
              auVar296._28_4_ = 0xbdebd1b8;
              auVar131 = vfmadd213ps_fma(auVar251,auVar204,auVar296);
              auVar297._8_4_ = 0x3def251a;
              auVar297._0_8_ = 0x3def251a3def251a;
              auVar297._12_4_ = 0x3def251a;
              auVar297._16_4_ = 0x3def251a;
              auVar297._20_4_ = 0x3def251a;
              auVar297._24_4_ = 0x3def251a;
              auVar297._28_4_ = 0x3def251a;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar204,auVar297);
              auVar298._8_4_ = 0xbdfe5d4f;
              auVar298._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar298._12_4_ = 0xbdfe5d4f;
              auVar298._16_4_ = 0xbdfe5d4f;
              auVar298._20_4_ = 0xbdfe5d4f;
              auVar298._24_4_ = 0xbdfe5d4f;
              auVar298._28_4_ = 0xbdfe5d4f;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar204,auVar298);
              auVar299._8_4_ = 0x3e11e9bf;
              auVar299._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar299._12_4_ = 0x3e11e9bf;
              auVar299._16_4_ = 0x3e11e9bf;
              auVar299._20_4_ = 0x3e11e9bf;
              auVar299._24_4_ = 0x3e11e9bf;
              auVar299._28_4_ = 0x3e11e9bf;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar204,auVar299);
              auVar300._8_4_ = 0xbe2aae50;
              auVar300._0_8_ = 0xbe2aae50be2aae50;
              auVar300._12_4_ = 0xbe2aae50;
              auVar300._16_4_ = 0xbe2aae50;
              auVar300._20_4_ = 0xbe2aae50;
              auVar300._24_4_ = 0xbe2aae50;
              auVar300._28_4_ = 0xbe2aae50;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar204,auVar300);
              auVar301._8_4_ = 0x3e4cceac;
              auVar301._0_8_ = 0x3e4cceac3e4cceac;
              auVar301._12_4_ = 0x3e4cceac;
              auVar301._16_4_ = 0x3e4cceac;
              auVar301._20_4_ = 0x3e4cceac;
              auVar301._24_4_ = 0x3e4cceac;
              auVar301._28_4_ = 0x3e4cceac;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar204,auVar301);
              auVar302._8_4_ = 0xbe7ffffc;
              auVar302._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar302._12_4_ = 0xbe7ffffc;
              auVar302._16_4_ = 0xbe7ffffc;
              auVar302._20_4_ = 0xbe7ffffc;
              auVar302._24_4_ = 0xbe7ffffc;
              auVar302._28_4_ = 0xbe7ffffc;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar204,auVar302);
              auVar303._8_4_ = 0x3eaaaaaa;
              auVar303._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar303._12_4_ = 0x3eaaaaaa;
              auVar303._16_4_ = 0x3eaaaaaa;
              auVar303._20_4_ = 0x3eaaaaaa;
              auVar303._24_4_ = 0x3eaaaaaa;
              auVar303._28_4_ = 0x3eaaaaaa;
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar204,auVar303);
              auVar252._0_4_ = auVar237._0_4_ * auVar204._0_4_ * auVar131._0_4_;
              auVar252._4_4_ = auVar237._4_4_ * auVar204._4_4_ * auVar131._4_4_;
              auVar252._8_4_ = auVar237._8_4_ * auVar204._8_4_ * auVar131._8_4_;
              auVar252._12_4_ = auVar237._12_4_ * auVar204._12_4_ * auVar131._12_4_;
              auVar252._16_4_ = auVar237._16_4_ * auVar204._16_4_ * 0.0;
              auVar252._20_4_ = auVar237._20_4_ * auVar204._20_4_ * 0.0;
              auVar252._24_4_ = auVar237._24_4_ * auVar204._24_4_ * 0.0;
              auVar252._28_4_ = 0;
              auVar77 = vcvtdq2ps_avx(auVar80);
              auVar131 = vfmadd231ps_fma(auVar252,auVar77,auVar351);
              auVar131 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar346,auVar237);
              auVar90 = vcmpps_avx(ZEXT1632(auVar215),_DAT_0059a1e0,2);
              auVar88 = vsubps_avx(ZEXT1632(auVar131),auVar204);
              auVar131 = vfmsub231ps_fma(auVar88,auVar357,auVar77);
              auVar253._8_4_ = 0xc0000000;
              auVar253._0_8_ = 0xc0000000c0000000;
              auVar253._12_4_ = 0xc0000000;
              auVar253._16_4_ = 0xc0000000;
              auVar253._20_4_ = 0xc0000000;
              auVar253._24_4_ = 0xc0000000;
              auVar253._28_4_ = 0xc0000000;
              auVar26._4_4_ = auVar131._4_4_ * -2.0;
              auVar26._0_4_ = auVar131._0_4_ * -2.0;
              auVar26._8_4_ = auVar131._8_4_ * -2.0;
              auVar26._12_4_ = auVar131._12_4_ * -2.0;
              auVar26._16_4_ = 0x80000000;
              auVar26._20_4_ = 0x80000000;
              auVar26._24_4_ = 0x80000000;
              auVar26._28_4_ = auVar77._28_4_;
              auVar205._8_4_ = 0x7fffffff;
              auVar205._0_8_ = 0x7fffffff7fffffff;
              auVar205._12_4_ = 0x7fffffff;
              auVar205._16_4_ = 0x7fffffff;
              auVar205._20_4_ = 0x7fffffff;
              auVar205._24_4_ = 0x7fffffff;
              auVar205._28_4_ = 0x7fffffff;
              auVar90 = vblendvps_avx(auVar26,auVar205,auVar90);
              auVar163._8_4_ = 0x42b0c0a5;
              auVar163._0_8_ = 0x42b0c0a542b0c0a5;
              auVar163._12_4_ = 0x42b0c0a5;
              auVar163._16_4_ = 0x42b0c0a5;
              auVar163._20_4_ = 0x42b0c0a5;
              auVar163._24_4_ = 0x42b0c0a5;
              auVar163._28_4_ = 0x42b0c0a5;
              auVar90 = vminps_avx(auVar90,auVar163);
              auVar164._8_4_ = 0xc2b0c0a5;
              auVar164._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar164._12_4_ = 0xc2b0c0a5;
              auVar164._16_4_ = 0xc2b0c0a5;
              auVar164._20_4_ = 0xc2b0c0a5;
              auVar164._24_4_ = 0xc2b0c0a5;
              auVar164._28_4_ = 0xc2b0c0a5;
              auVar77 = vmaxps_avx(auVar90,auVar164);
              auVar165._8_4_ = 0x3fb8aa3b;
              auVar165._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar165._12_4_ = 0x3fb8aa3b;
              auVar165._16_4_ = 0x3fb8aa3b;
              auVar165._20_4_ = 0x3fb8aa3b;
              auVar165._24_4_ = 0x3fb8aa3b;
              auVar165._28_4_ = 0x3fb8aa3b;
              auVar131 = vfmadd213ps_fma(auVar165,auVar77,auVar346);
              auVar88 = vroundps_avx(ZEXT1632(auVar131),1);
              auVar90 = vcmpps_avx(ZEXT1632(auVar131),auVar88,1);
              auVar90 = vandps_avx(auVar272,auVar90);
              auVar90 = vsubps_avx(auVar88,auVar90);
              auVar131 = vfmsub231ps_fma(auVar77,auVar90,auVar357);
              auVar186 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar90,auVar351);
              auVar77 = ZEXT1632(auVar186);
              auVar27._28_4_ = auVar88._28_4_;
              auVar27._0_28_ =
                   ZEXT1628(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                      CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                               CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                        auVar186._0_4_ * auVar186._0_4_))));
              auVar304._8_4_ = 0x3ab743ce;
              auVar304._0_8_ = 0x3ab743ce3ab743ce;
              auVar304._12_4_ = 0x3ab743ce;
              auVar304._16_4_ = 0x3ab743ce;
              auVar304._20_4_ = 0x3ab743ce;
              auVar304._24_4_ = 0x3ab743ce;
              auVar304._28_4_ = 0x3ab743ce;
              auVar131 = vfmadd213ps_fma(auVar371,auVar77,auVar304);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar377);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar273);
              auVar288 = ZEXT3264(auVar272);
              auVar305._8_4_ = 0x3e2aaaaa;
              auVar305._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar305._12_4_ = 0x3e2aaaaa;
              auVar305._16_4_ = 0x3e2aaaaa;
              auVar305._20_4_ = 0x3e2aaaaa;
              auVar305._24_4_ = 0x3e2aaaaa;
              auVar305._28_4_ = 0x3e2aaaaa;
              auVar77 = ZEXT1632(auVar186);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar305);
              auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar346);
              auVar215 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar27,auVar77);
              auVar59._0_4_ = (int)auVar90._0_4_;
              auVar59._4_4_ = (int)auVar90._4_4_;
              auVar59._8_4_ = (int)auVar90._8_4_;
              auVar59._12_4_ = (int)auVar90._12_4_;
              auVar81._16_4_ = (int)auVar90._16_4_;
              auVar81._0_16_ = auVar59;
              auVar81._20_4_ = (int)auVar90._20_4_;
              auVar81._24_4_ = (int)auVar90._24_4_;
              auVar81._28_4_ = (int)auVar90._28_4_;
              auVar186 = vpslld_avx(auVar59,0x17);
              auVar131 = vpslld_avx(auVar81._16_16_,0x17);
              auVar131 = vpaddd_avx(auVar325,auVar131);
              auVar186 = vpaddd_avx(auVar325,auVar186);
              auVar82._16_16_ = auVar131;
              auVar82._0_16_ = auVar186;
              auVar166._0_4_ = fVar307 + auVar215._0_4_;
              auVar166._4_4_ = fVar319 + auVar215._4_4_;
              auVar166._8_4_ = fVar185 + auVar215._8_4_;
              auVar166._12_4_ = fVar320 + auVar215._12_4_;
              auVar166._16_4_ = fVar321 + 0.0;
              auVar166._20_4_ = fVar322 + 0.0;
              auVar166._24_4_ = fVar323 + 0.0;
              auVar166._28_4_ = fVar324 + 0.0;
              auVar131 = vfmadd213ps_fma(auVar82,auVar166,auVar272);
              auVar90 = vrcpps_avx(ZEXT1632(auVar131));
              auVar131 = vfmsub213ps_fma(ZEXT1632(auVar131),auVar90,auVar272);
              auVar131 = vfnmadd132ps_fma(ZEXT1632(auVar131),auVar90,auVar90);
              auVar131 = vfnmadd213ps_fma(ZEXT1632(auVar131),auVar253,auVar364);
              auVar110 = ZEXT1628(auVar131);
              goto LAB_002ee028;
            case 6:
              uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar87._4_4_ = uVar2;
              auVar87._0_4_ = uVar2;
              auVar87._8_4_ = uVar2;
              auVar87._12_4_ = uVar2;
              auVar87._16_4_ = uVar2;
              auVar87._20_4_ = uVar2;
              auVar87._24_4_ = uVar2;
              auVar87._28_4_ = uVar2;
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar170._4_4_ = uVar2;
              auVar170._0_4_ = uVar2;
              auVar170._8_4_ = uVar2;
              auVar170._12_4_ = uVar2;
              auVar170._16_4_ = uVar2;
              auVar170._20_4_ = uVar2;
              auVar170._24_4_ = uVar2;
              auVar170._28_4_ = uVar2;
              auVar131 = vfmadd231ps_fma(auVar170,auVar112,auVar87);
              auVar90 = vmaxps_avx(ZEXT1632(auVar131),_DAT_0059a1e0);
              auVar272 = vminps_avx(auVar90,auVar272);
              auVar110 = auVar272._0_28_;
LAB_002ee028:
              auVar112._4_4_ = auVar110._4_4_ * fVar129;
              auVar112._0_4_ = auVar110._0_4_ * fVar94;
              auVar112._8_4_ = auVar110._8_4_ * auVar112._8_4_;
              auVar112._12_4_ = auVar110._12_4_ * auVar112._12_4_;
              auVar112._16_4_ = auVar110._16_4_ * auVar112._16_4_;
              auVar112._20_4_ = auVar110._20_4_ * auVar112._20_4_;
              auVar112._24_4_ = auVar110._24_4_ * auVar112._24_4_;
            }
            *(undefined1 (*) [32])((long)top_blob->data + uVar34 * 0x20) = auVar112;
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar32);
        }
        iVar43 = 0;
      }
    }
    piVar20 = (int *)CONCAT44(uStack_3ac,uStack_3b0);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_398 == (Allocator *)0x0) {
          if (local_3b8 != (undefined1 (*) [32])0x0) {
            free(local_3b8);
          }
        }
        else {
          (*local_398->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar43;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}